

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ralocal.cpp
# Opt level: O1

Error __thiscall
asmjit::v1_14::RALocalAllocator::spillScratchGpRegsBeforeEntry
          (RALocalAllocator *this,RegMask scratchRegs)

{
  byte *pbVar1;
  BaseNode BVar2;
  byte bVar3;
  byte bVar4;
  Signature SVar5;
  PhysToWorkMap *pPVar6;
  _func_int **pp_Var7;
  char *pcVar8;
  _func_int *p_Var9;
  long lVar10;
  BaseNode *pBVar11;
  void *__src;
  BaseBuilder *pBVar12;
  undefined8 uVar13;
  undefined8 uVar14;
  undefined8 uVar15;
  undefined1 *puVar16;
  undefined4 workId;
  RegGroup RVar17;
  uint uVar18;
  uint uVar19;
  uint uVar20;
  uint32_t uVar21;
  int iVar22;
  Error EVar23;
  BaseRAPass **ppBVar24;
  RAStackSlot *pRVar25;
  RABlock *pRVar26;
  byte bVar27;
  uint uVar28;
  BaseRAPass *pBVar29;
  BaseRAPass *pBVar30;
  BaseRAPass *pBVar31;
  BaseRAPass *pBVar32;
  BaseRAPass *pBVar33;
  ulong uVar34;
  uint extraout_EDX;
  uint extraout_EDX_00;
  RABlock *block;
  BaseRAPass *unaff_RBX;
  BaseRAPass *pBVar35;
  BaseRAPass *pBVar36;
  long lVar37;
  BaseRAPass *pBVar38;
  uint *puVar39;
  InstNode *node;
  BaseRAPass *pBVar40;
  BaseRAPass *pBVar41;
  BaseRAPass *in_R9;
  BaseRAPass *pBVar42;
  BaseRAPass *pBVar43;
  BaseRAPass *pBVar44;
  uint uVar45;
  BaseRAPass *pBVar46;
  ulong uVar47;
  uint uVar48;
  BaseRAPass *pBVar49;
  BaseRAPass *pBVar50;
  int iVar51;
  BaseRAPass *unaff_R15;
  InstNode *pIVar52;
  bool bVar53;
  undefined4 uStack_428;
  undefined4 uStack_424;
  undefined4 uStack_420;
  undefined4 uStack_41c;
  undefined8 uStack_418;
  undefined8 uStack_410;
  ulong uStack_400;
  BaseRAPass *pBStack_3f8;
  BaseRAPass *pBStack_3f0;
  BaseRAPass *pBStack_3e8;
  InstNode *pIStack_3e0;
  long lStack_3d8;
  Error EStack_3cc;
  ulong uStack_3c8;
  BaseRAPass *pBStack_3c0;
  InstNode *pIStack_3b8;
  BaseRAPass *pBStack_3b0;
  BaseRAPass *pBStack_3a8;
  BaseRAPass *pBStack_3a0;
  BaseRAPass *pBStack_398;
  BaseRAPass *pBStack_390;
  BaseRAPass *pBStack_388;
  BaseRAPass **ppBStack_380;
  BaseRAPass *pBStack_378;
  BaseRAPass *pBStack_370;
  BaseRAPass *pBStack_368;
  BaseRAPass *pBStack_360;
  BaseRAPass **ppBStack_358;
  code *pcStack_350;
  code *pcStack_348;
  uint uStack_33c;
  BaseRAPass *pBStack_338;
  BaseRAPass *pBStack_330;
  BaseRAPass *pBStack_328;
  uint uStack_31c;
  undefined8 uStack_318;
  BaseRAPass *pBStack_310;
  uint uStack_308;
  uint uStack_304;
  BaseRAPass *pBStack_300;
  BaseRAPass *pBStack_2f8;
  uint uStack_2f0;
  uint uStack_2ec;
  BaseRAPass *pBStack_2e8;
  undefined8 uStack_2e0;
  undefined8 uStack_2d8;
  uint uStack_2cc;
  BaseRAPass *pBStack_2c8;
  ulong uStack_2c0;
  BaseRAPass *pBStack_2b8;
  undefined1 auStack_2b0 [48];
  BaseRAPass *pBStack_280;
  uint *puStack_278;
  undefined8 auStack_270 [32];
  undefined8 auStack_170 [33];
  BaseRAPass *pBStack_68;
  ulong uStack_60;
  ulong uStack_58;
  RALocalAllocator *pRStack_50;
  BaseRAPass *pBStack_48;
  ulong uStack_40;
  BaseRAPass *local_38;
  
  uVar47 = (ulong)scratchRegs;
  local_38 = (BaseRAPass *)&this->_curAssignment;
  pBVar33 = (BaseRAPass *)this;
  do {
    uVar19 = (uint)uVar47;
    if (uVar19 == 0) {
      unaff_RBX = (BaseRAPass *)0x0;
      break;
    }
    uVar20 = 0;
    if (uVar19 != 0) {
      for (; (uVar19 >> uVar20 & 1) == 0; uVar20 = uVar20 + 1) {
      }
    }
    uVar18 = 1 << ((byte)uVar20 & 0x1f);
    if (((((this->_curAssignment)._physToWorkMap)->assigned)._masks._data[0] >> (uVar20 & 0x1f) & 1)
        == 0) {
      bVar53 = true;
    }
    else {
      pPVar6 = (this->_curAssignment)._physToWorkMap;
      pBVar31 = (BaseRAPass *)(ulong)uVar20;
      uVar45 = (this->_curAssignment)._physToWorkIds._data[0][(long)pBVar31];
      uVar34 = (ulong)uVar45;
      uVar28 = (pPVar6->dirty)._masks._data[0];
      if ((uVar28 & uVar18) != 0) {
        if (uVar45 == 0xffffffff) {
          uStack_40 = 0x1236fe;
          spillScratchGpRegsBeforeEntry();
LAB_001236fe:
          uStack_40 = 0x123703;
          spillScratchGpRegsBeforeEntry();
LAB_00123703:
          uStack_40 = 0x123708;
          spillScratchGpRegsBeforeEntry();
        }
        else {
          if ((this->_curAssignment)._layout.workCount <= uVar45) goto LAB_001236fe;
          bVar27 = (this->_curAssignment)._workToPhysMap[uVar34].physIds[0];
          pBVar33 = (BaseRAPass *)(ulong)bVar27;
          if (uVar20 != bVar27) goto LAB_00123703;
          pBVar33 = (BaseRAPass *)(this->_curAssignment)._physToWorkIds._data[0];
          if (*(uint *)(&pBVar33->_allocator + (long)(&pBVar31[-1].field_0x3b0 + 0xfa) * 4) ==
              uVar45) {
            (pPVar6->dirty)._masks._data[0] = uVar28 & ~uVar18;
            pBVar33 = this->_pass;
            uStack_40 = 0x1236a9;
            uVar18 = (**(code **)&((BaseRAPass *)(pBVar33->super_FuncPass).super_Pass._vptr_Pass)->
                                  field_0x60)(pBVar33,uVar34,uVar20);
            unaff_R15 = (BaseRAPass *)(ulong)uVar18;
            if (uVar18 == 0) goto LAB_001236b0;
            goto LAB_001236c3;
          }
        }
        uStack_40 = 0x12370d;
        spillScratchGpRegsBeforeEntry();
        uStack_40 = (ulong)uVar20;
        pBStack_48 = unaff_R15;
        pRStack_50 = this;
        uStack_58 = uVar34;
        uStack_60 = uVar47;
        pBStack_68 = unaff_RBX;
        pBStack_280 = pBVar31;
        pBStack_2b8 = *(BaseRAPass **)&pBVar31->field_0x20;
        ((pBVar33->super_FuncPass).super_Pass._cb)->_cursor =
             (BaseNode *)(pBVar31->super_FuncPass).super_Pass._vptr_Pass;
        *(BaseRAPass **)&pBVar33->_instructionCount = pBVar31;
        *(BaseRAPass **)&pBVar33->_sharedAssignments = pBStack_2b8;
        *(undefined4 *)&pBVar33->field_0xf0 =
             *(undefined4 *)&(pBStack_2b8->super_FuncPass).super_Pass._name;
        *(uint *)&pBVar33->field_0xf4 = (((RARegMask *)&pBStack_2b8->_allocator)->_masks)._data[0];
        pBStack_300 = (BaseRAPass *)&pBVar33->field_0x48;
        puStack_278 = (((RARegMask *)&pBVar31->field_0x38)->_masks)._data + 2;
        pBVar31 = (BaseRAPass *)0x0;
        uStack_2c0 = 0;
        pBStack_330 = pBVar33;
        goto LAB_0012378e;
      }
LAB_001236b0:
      unaff_R15 = (BaseRAPass *)0x0;
      uStack_40 = 0x1236c3;
      pBVar33 = local_38;
      RAAssignment::unassign((RAAssignment *)local_38,k0,uVar45,uVar20);
LAB_001236c3:
      bVar53 = (int)unaff_R15 == 0;
      unaff_RBX = (BaseRAPass *)((ulong)unaff_RBX & 0xffffffff);
      if (!bVar53) {
        unaff_RBX = unaff_R15;
      }
    }
    uVar47 = (ulong)(uVar19 - 1 & uVar19);
  } while (bVar53);
  return (Error)unaff_RBX;
  while (pBVar31 = (BaseRAPass *)((long)&(pBVar31->super_FuncPass).super_Pass._vptr_Pass + 1),
        pBVar31 != (BaseRAPass *)0x4) {
LAB_0012378e:
    pBVar36 = (BaseRAPass *)0x0;
    bVar27 = (char)pBVar31 * '\b';
    uStack_318 = *(BaseRAPass **)&pBVar33->_sharedAssignments;
    pBVar29 = (BaseRAPass *)0xff;
    uVar19 = *(uint *)((long)&(uStack_318->super_FuncPass).super_Pass._name + 4) >> (bVar27 & 0x1f)
             & 0xff;
    pBStack_310 = (BaseRAPass *)(ulong)uVar19;
    pBVar44 = (BaseRAPass *)(&uStack_318->field_0x48 + (ulong)(uVar19 << 5) + 4);
    uStack_31c = *(uint *)(&uStack_318->field_0x28 +
                          (long)((long)&(pBVar31->super_FuncPass).super_Pass._vptr_Pass + 1) * 4);
    uStack_2ec = *(uint *)(&uStack_318->field_0x38 +
                          (long)((long)&(pBVar31->super_FuncPass).super_Pass._vptr_Pass + 1) * 4);
    uStack_2cc = *(uint *)&pBVar33->field_0xf4 >> (bVar27 & 0x1f) & 0xff;
    pBVar38 = (BaseRAPass *)(ulong)uStack_2cc;
    pBVar41 = pBVar44;
    pBStack_338 = pBVar31;
    pBStack_328 = pBVar44;
    if (uStack_2cc == 0) {
      uVar20 = 0;
      uStack_2d8 = (BaseRAPass *)((ulong)uStack_2d8._4_4_ << 0x20);
      pBVar32 = (BaseRAPass *)0x0;
      pBVar42 = (BaseRAPass *)0x0;
      pBVar40 = uStack_318;
      pBVar50 = (BaseRAPass *)0x0;
    }
    else {
      pBVar40 = (BaseRAPass *)(ulong)uStack_2cc;
      pBVar42 = (BaseRAPass *)0x0;
      pBVar32 = (BaseRAPass *)(ulong)uStack_2cc;
      uStack_2d8 = (BaseRAPass *)((ulong)uStack_2d8._4_4_ << 0x20);
      uVar20 = 0;
      pBVar50 = (BaseRAPass *)0x0;
      do {
        uVar18 = *(uint *)&(pBVar41->super_FuncPass).super_Pass._cb;
        pBVar49 = pBVar50;
        if ((uVar18 & 0x1c00) == 0) {
          in_R9 = (BaseRAPass *)(ulong)uVar20;
LAB_00123857:
          if ((uVar18 & 0x40008) != 0) {
            pBVar49 = (BaseRAPass *)(ulong)((int)pBVar50 + 1);
            auStack_270[(long)pBVar50] = pBVar41;
          }
          if ((uVar18 >> 0x10 & 1) != 0) {
            uVar47 = (ulong)uStack_2d8 & 0xffffffff;
            pBVar29 = (BaseRAPass *)(ulong)((int)uStack_2d8 + 1U);
            uStack_2d8 = (BaseRAPass *)CONCAT44(uStack_2d8._4_4_,(int)uStack_2d8 + 1U);
            auStack_170[uVar47] = pBVar41;
          }
          iVar22 = (int)pBVar32;
          uVar20 = (uint)in_R9;
          if ((uVar18 & 4) == 0) {
            *(uint *)&(pBVar41->super_FuncPass).super_Pass._cb = uVar18 | 0x100;
            pBVar32 = (BaseRAPass *)(ulong)(iVar22 - 1);
            pBVar38 = (BaseRAPass *)0x6;
          }
          else {
            pBVar38 = (BaseRAPass *)0x6;
            if ((uVar18 >> 10 & 1) == 0) {
              uVar45 = *(uint *)&(pBVar41->super_FuncPass).super_Pass._vptr_Pass;
              pBVar29 = (BaseRAPass *)0xffffffff;
              if ((ulong)uVar45 == 0xffffffff) goto LAB_00124d60;
              if (*(uint *)(&pBVar33->field_0x48 + 0xc) <= uVar45) goto LAB_00124d65;
              bVar27 = *(byte *)(*(long *)(&pBVar33->field_0x48 + 0x18) + (ulong)uVar45);
              bVar3 = *(undefined1 *)((long)&(pBVar41->super_FuncPass).super_Pass._cb + 6);
              pBVar29 = (BaseRAPass *)(ulong)bVar3;
              if (bVar3 == 0xff) {
                pBVar38 = (BaseRAPass *)0x0;
                if (bVar27 != 0xff) {
                  uVar28 = 1 << (bVar27 & 0x1f);
                  uVar45 = ~uStack_31c & *(uint *)&(pBVar41->super_FuncPass).super_Pass._name;
                  pBVar29 = (BaseRAPass *)(ulong)uVar45;
                  if ((uVar45 >> (bVar27 & 0x1f) & 1) == 0) {
                    pBVar42 = (BaseRAPass *)(ulong)((uint)pBVar42 | uVar28);
                  }
                  else {
                    *(byte *)((long)&(pBVar41->super_FuncPass).super_Pass._cb + 6) = bVar27;
                    *(uint *)&(pBVar41->super_FuncPass).super_Pass._cb = uVar18 | 0x100;
                    if ((uVar18 & 2) != 0) {
                      puVar39 = (uint *)(*(long *)(&pBVar33->field_0x48 + 0x20) + 0x10 +
                                        (long)pBVar31 * 4);
                      *puVar39 = *puVar39 | uVar28;
                    }
                    pBVar32 = (BaseRAPass *)(ulong)(iVar22 - 1);
                    uStack_31c = uStack_31c | uVar28;
                  }
                  pBVar38 = (BaseRAPass *)0x0;
                }
              }
              else {
                uVar45 = 1 << (bVar3 & 0x1f);
                pBVar38 = (BaseRAPass *)(ulong)uStack_31c;
                pBVar50 = pBVar49;
                if ((uStack_31c >> (bVar3 & 0x1f) & 1) == 0) goto LAB_00124d8d;
                if (bVar27 == bVar3) {
                  *(uint *)&(pBVar41->super_FuncPass).super_Pass._cb = uVar18 | 0x100;
                  pBVar29 = (BaseRAPass *)(ulong)(uVar18 | 0x100);
                  if ((uVar18 & 2) != 0) {
                    puVar39 = (uint *)(*(long *)(&pBVar33->field_0x48 + 0x20) + 0x10 +
                                      (long)pBVar31 * 4);
                    *puVar39 = *puVar39 | 1 << (bVar27 & 0x1f);
                    pBVar29 = pBVar31;
                  }
                  pBVar32 = (BaseRAPass *)(ulong)(iVar22 - 1);
                  uStack_31c = uStack_31c | uVar45;
                }
                else {
                  pBVar42 = (BaseRAPass *)
                            (ulong)((uint)pBVar42 |
                                   uVar45 & *(uint *)(*(long *)(&pBVar33->field_0x48 + 0x20) +
                                                     (long)pBVar31 * 4));
                }
                pBVar38 = (BaseRAPass *)0x0;
              }
            }
          }
        }
        else {
          pBVar29 = (BaseRAPass *)(ulong)(uVar18 >> 0xd & 3);
          if ((uVar18 >> 0xc & 1) != 0) {
            pBVar29 = pBVar36;
          }
          uVar45 = 1 << (sbyte)pBVar29;
          if ((uVar20 >> (int)pBVar29 & 1) == 0) {
            *(BaseRAPass **)(auStack_2b0 + (long)pBVar29 * 8 + 0x10) = pBVar41;
            uVar28 = uVar45 | uVar20;
          }
          else {
            uStack_33c = 3;
            uVar28 = uVar20;
          }
          in_R9 = (BaseRAPass *)(ulong)uVar28;
          if ((uVar45 & uVar20) == 0) goto LAB_00123857;
          pBVar38 = (BaseRAPass *)0x1;
          uVar20 = uVar28;
        }
        if (((int)pBVar38 != 6) && ((int)pBVar38 != 0)) goto LAB_00124d0e;
        pBVar41 = (BaseRAPass *)&pBVar41->field_0x20;
        pBVar40 = (BaseRAPass *)&pBVar40[-1].field_0x4af;
        pBVar50 = pBVar49;
      } while (pBVar40 != (BaseRAPass *)0x0);
    }
    uVar13 = auStack_2b0._16_8_;
    pBStack_2f8 = (BaseRAPass *)((ulong)pBStack_2f8 & 0xffffffff00000000);
    uStack_304 = (uint)pBVar50;
    pBVar46 = pBVar42;
    if (uVar20 == 0) {
      pBStack_2c8 = (BaseRAPass *)0x0;
LAB_00123c9f:
      pBVar30 = pBVar29;
      pBVar35 = pBVar32;
      pBVar29 = pBVar46;
      if ((uint)pBVar32 != 0) {
        pBVar38 = (BaseRAPass *)0x0;
        pBVar29 = (BaseRAPass *)(ulong)uStack_2cc;
        if (uStack_2cc != 0) {
          pBVar36 = (BaseRAPass *)
                    (ulong)(~(uint)pBVar46 &
                           *(uint *)(*(long *)(&pBVar33->field_0x48 + 0x20) + (long)pBVar31 * 4));
          pBVar40 = (BaseRAPass *)(&uStack_318->field_0x48 + (ulong)(uVar19 << 5) + 0x1c);
          in_R9 = (BaseRAPass *)(ulong)(uStack_2cc << 5);
          pBVar35 = (BaseRAPass *)0x0;
          uStack_308 = (uint)pBVar32;
          pBStack_2f8 = pBVar40;
          pBStack_2e8 = in_R9;
          do {
            pBVar38 = (BaseRAPass *)0x0;
            uVar19 = *(uint *)((long)&(pBVar35->super_FuncPass).super_Pass._vptr_Pass +
                              (long)&pBVar40[-1].field_0x4a0);
            pBVar50 = (BaseRAPass *)0x16;
            if ((uVar19 >> 8 & 1) == 0) {
              uVar20 = *(uint *)((long)&(pBVar35->super_FuncPass).super_Pass._vptr_Pass +
                                (long)&pBVar40[-1].field_0x498);
              unaff_R15 = (BaseRAPass *)(ulong)uVar20;
              pBVar30 = (BaseRAPass *)0xffffffff;
              if (unaff_R15 == (BaseRAPass *)0xffffffff) goto LAB_00124d74;
              pBVar42 = pBVar46;
              if (*(uint *)(&pBVar33->field_0x48 + 0xc) <= uVar20) goto LAB_00124d79;
              pBVar29 = *(BaseRAPass **)(&pBVar33->field_0x48 + 0x18);
              BVar2 = *(BaseNode *)
                       ((long)&(pBVar29->super_FuncPass).super_Pass._vptr_Pass + (long)unaff_R15);
              uVar18 = (uint)(byte)BVar2;
              pBVar42 = pBVar33;
              if ((((uStack_2c0 & 1) == 0) && ((uVar19 & 0x10) != 0)) && (BVar2 == (BaseNode)0xff))
              {
                uVar19 = *(uint *)((long)&pBVar40[1].super_FuncPass.super_Pass._vptr_Pass +
                                  (long)(pBVar35 + -1));
                pBVar33 = (BaseRAPass *)(ulong)uVar19;
                uVar45 = uVar19 ^ uVar19 - 1;
                pBVar29 = (BaseRAPass *)(ulong)uVar45;
                pBVar42 = pBStack_330;
                if (uVar19 - 1 < uVar45) {
                  pBVar42 = (BaseRAPass *)(pBStack_330->super_FuncPass).super_Pass._vptr_Pass;
                  pBStack_310 = pBVar46;
                  if (*(uint *)&pBVar42->field_0x148 <= uVar20) goto LAB_00124da1;
                  uStack_2e0 = *(uint32_t **)(*(long *)&pBVar42->_workRegs + (long)unaff_R15 * 8);
                  bVar27 = *(byte *)((long)&(pBVar35->super_FuncPass).super_Pass._vptr_Pass +
                                    (long)&pBVar40[-1].field_0x4a5);
                  pBVar41 = (BaseRAPass *)(ulong)bVar27;
                  uVar45 = *(uint *)(*(long *)(uStack_2e0 + 2) + 8);
                  pBVar50 = (BaseRAPass *)0x0;
                  uVar18 = (uint)(byte)BVar2;
                  if (bVar27 <= uVar45) {
                    uStack_2f0 = uVar45;
                    uVar18 = (uint)(byte)BVar2;
                    if (*(long *)(uStack_2e0 + 6) == 0) {
                      uStack_2c0 = CONCAT44(uStack_2c0._4_4_,(uint)bVar27);
                      uStack_318 = (BaseRAPass *)CONCAT44(uStack_318._4_4_,0xff);
                      pcStack_348 = (code *)0x123e8f;
                      pRVar25 = RAStackAllocator::newSlot
                                          (&pBVar42->_stackAllocator,
                                           (pBVar42->_sp).super_Operand.super_Operand_._baseId,
                                           uVar45,(uint)*(byte *)(*(long *)(uStack_2e0 + 2) + 0xc),1
                                          );
                      pBVar41 = (BaseRAPass *)(uStack_2c0 & 0xffffffff);
                      uVar18 = (uint)uStack_318;
                      *(RAStackSlot **)(uStack_2e0 + 6) = pRVar25;
                      *(byte *)((long)uStack_2e0 + 0x25) = *(byte *)((long)uStack_2e0 + 0x25) | 1;
                      pBVar40 = pBStack_2f8;
                      pBVar44 = pBStack_328;
                    }
                    uVar45 = 0;
                    if (uVar19 != 0) {
                      for (; (uVar19 >> uVar45 & 1) == 0; uVar45 = uVar45 + 1) {
                      }
                    }
                    puVar39 = puStack_278 + (uVar45 & 0xfffffffc);
                    SVar5._bits = (pBVar42->_sp).super_Operand.super_Operand_._signature._bits;
                    puVar39[1] = uStack_2e0[1];
                    (puVar39 + 2)[0] = 0;
                    (puVar39 + 2)[1] = 0;
                    *puVar39 = (SVar5._bits & 0xf8) + (int)pBVar41 * 0x1000000 + 0x2002;
                    *(undefined4 *)
                     ((long)&pBVar40[1].super_FuncPass.super_Pass._vptr_Pass + (long)(pBVar35 + -1))
                         = 0;
                    pbVar1 = (byte *)((long)&(pBVar35->super_FuncPass).super_Pass._vptr_Pass +
                                     (long)&pBVar40[-1].field_0x4a1);
                    *pbVar1 = *pbVar1 | 1;
                    puVar16 = (undefined1 *)
                              ((long)&(pBStack_2b8->super_FuncPass).super_Pass._cb + 7);
                    *puVar16 = *puVar16 | 0x40;
                    uStack_308 = uStack_308 - 1;
                    uStack_2c0 = CONCAT71((int7)((ulong)pBStack_2b8 >> 8),1);
                    pBVar50 = (BaseRAPass *)0x16;
                    pBVar31 = pBStack_338;
                    uVar45 = uStack_2f0;
                  }
                  pBVar29 = (BaseRAPass *)(ulong)uVar45;
                  pBVar33 = pBStack_330;
                  pBVar42 = pBStack_330;
                  pBVar46 = pBStack_310;
                  if ((uint)pBVar41 <= uVar45) goto LAB_00124087;
                }
              }
              uVar19 = uStack_31c;
              pBVar50 = (BaseRAPass *)0x0;
              pBVar33 = pBVar42;
              if (*(char *)((long)&(pBVar35->super_FuncPass).super_Pass._vptr_Pass +
                           (long)&pBVar40[-1].field_0x4a6) == -1) {
                pBStack_310 = (BaseRAPass *)CONCAT44(pBStack_310._4_4_,(int)pBVar36);
                uStack_2e0 = (uint32_t *)
                             (CONCAT44(uStack_2e0._4_4_,(int)pBVar31) & 0xffffffff000000ff);
                uStack_318 = (BaseRAPass *)CONCAT44(uStack_318._4_4_,uVar18);
                pcStack_348 = (code *)0x123d76;
                uVar21 = decideOnAssignment((RALocalAllocator *)pBVar42,(RegGroup)pBVar31,uVar20,
                                            (uint32_t)pBVar29,
                                            ~(uStack_31c | (uint)pBVar46) &
                                            *(uint *)((long)&(pBVar35->super_FuncPass).super_Pass.
                                                             _vptr_Pass +
                                                     (long)&pBVar40[-1].field_0x4a8));
                pBVar41 = (BaseRAPass *)((ulong)uStack_318 & 0xffffffff);
                pBVar29 = (BaseRAPass *)(ulong)uVar21;
                uVar18 = 1 << ((byte)uVar21 & 0x1f);
                uStack_31c = uVar19 | 1 << (uVar21 & 0x1f);
                uVar19 = (uint)pBStack_310;
                pBVar36 = (BaseRAPass *)((ulong)pBStack_310 & 0xffffffff);
                uVar45 = (uint)pBVar46 | uVar18 & (uint)pBStack_310;
                pBVar46 = (BaseRAPass *)(ulong)uVar45;
                *(byte *)((long)&(pBVar35->super_FuncPass).super_Pass._vptr_Pass +
                         (long)&pBStack_2f8[-1].field_0x4a6) = (byte)uVar21;
                if ((uint)uStack_318 == 0xff) {
                  if ((uVar18 & (uint)pBStack_310) == 0) {
                    pBVar41 = (BaseRAPass *)0x0;
                    pcStack_348 = (code *)0x124005;
                    uStack_2f0 = uVar18;
                    RAAssignment::assign
                              ((RAAssignment *)pBStack_300,(RegGroup)uStack_2e0,uVar20,uVar21,false)
                    ;
                    pp_Var7 = (pBStack_330->super_FuncPass).super_Pass._vptr_Pass;
                    pcStack_348 = (code *)0x124019;
                    uVar20 = (**(code **)(*pp_Var7 + 0x58))(pp_Var7,unaff_R15,uVar21);
                    if (uVar20 != 0) {
                      uStack_33c = uVar20;
                    }
                    pBVar29 = (BaseRAPass *)(ulong)uStack_33c;
                    if (uVar20 != 0) {
                      pBVar50 = (BaseRAPass *)0x1;
                      pBVar31 = pBStack_338;
                      pBVar40 = pBStack_2f8;
                      in_R9 = pBStack_2e8;
                      pBVar44 = pBStack_328;
                      pBVar33 = pBStack_330;
                      goto LAB_00124087;
                    }
                    uVar20 = *(uint *)((long)&(pBVar35->super_FuncPass).super_Pass._vptr_Pass +
                                      (long)&pBStack_2f8[-1].field_0x4a0);
                    uVar18 = uVar20 | 0x100;
                    pBVar29 = (BaseRAPass *)(ulong)uVar18;
                    *(uint *)((long)&(pBVar35->super_FuncPass).super_Pass._vptr_Pass +
                             (long)&pBStack_2f8[-1].field_0x4a0) = uVar18;
                    if ((uVar20 & 2) != 0) {
                      puVar39 = (uint *)(*(long *)(&pBStack_330->field_0x48 + 0x20) + 0x10 +
                                        (long)pBStack_338 * 4);
                      *puVar39 = *puVar39 | uStack_2f0;
                    }
                    uStack_308 = uStack_308 - 1;
                    uVar18 = uStack_2f0;
                  }
                }
                else {
                  uVar19 = (uint)pBStack_310 & ~(1 << ((uint)uStack_318 & 0x1f));
                  pBVar36 = (BaseRAPass *)(ulong)uVar19;
                  bVar53 = true;
                  if ((uVar18 & uVar19) == 0) {
                    uVar28 = 0;
                    if (uVar21 != (uint)uStack_318) {
                      pcStack_348 = (code *)0x123f93;
                      uStack_2f0 = uVar18;
                      RAAssignment::reassign
                                ((RAAssignment *)pBStack_300,(RegGroup)uStack_2e0,uVar20,uVar21,
                                 (uint)uStack_318);
                      pp_Var7 = (pBStack_330->super_FuncPass).super_Pass._vptr_Pass;
                      pcStack_348 = (code *)0x123fab;
                      uVar28 = (**(code **)(*pp_Var7 + 0x48))
                                         (pp_Var7,unaff_R15,uVar21,(ulong)uStack_318 & 0xffffffff);
                      pBVar41 = (BaseRAPass *)((ulong)uStack_318 & 0xffffffff);
                      uVar18 = uStack_2f0;
                    }
                    if (uVar28 != 0) {
                      uStack_33c = uVar28;
                    }
                    pBVar29 = (BaseRAPass *)(ulong)uStack_33c;
                    if (uVar28 == 0) {
                      uVar20 = *(uint *)((long)&(pBVar35->super_FuncPass).super_Pass._vptr_Pass +
                                        (long)&pBStack_2f8[-1].field_0x4a0);
                      uVar28 = uVar20 | 0x100;
                      pBVar29 = (BaseRAPass *)(ulong)uVar28;
                      *(uint *)((long)&(pBVar35->super_FuncPass).super_Pass._vptr_Pass +
                               (long)&pBStack_2f8[-1].field_0x4a0) = uVar28;
                      if ((uVar20 & 2) != 0) {
                        puVar39 = (uint *)(*(long *)(&pBStack_330->field_0x48 + 0x20) + 0x10 +
                                          (long)pBStack_338 * 4);
                        *puVar39 = *puVar39 | uVar18;
                      }
                      uStack_308 = uStack_308 - 1;
                      bVar53 = true;
                    }
                    else {
                      bVar53 = false;
                    }
                  }
                  pBVar46 = (BaseRAPass *)(ulong)(uVar45 | 1 << ((uint)pBVar41 & 0x1f));
                  if (!bVar53) {
                    pBVar50 = (BaseRAPass *)0x1;
                    pBVar31 = pBStack_338;
                    pBVar40 = pBStack_2f8;
                    in_R9 = pBStack_2e8;
                    pBVar44 = pBStack_328;
                    pBVar33 = pBStack_330;
                    goto LAB_00124087;
                  }
                }
                pBVar36 = (BaseRAPass *)(ulong)(uVar19 | uVar18);
                pBVar31 = pBStack_338;
                pBVar40 = pBStack_2f8;
                in_R9 = pBStack_2e8;
                pBVar44 = pBStack_328;
                pBVar33 = pBStack_330;
              }
            }
LAB_00124087:
          } while ((((int)pBVar50 == 0x16) || (pBVar38 = pBVar50, (int)pBVar50 == 0)) &&
                  (pBVar35 = (BaseRAPass *)&pBVar35->field_0x20, pBVar38 = (BaseRAPass *)0x0,
                  in_R9 != pBVar35));
          pBVar32 = (BaseRAPass *)(ulong)uStack_308;
        }
        pBStack_2f8 = (BaseRAPass *)CONCAT44(pBStack_2f8._4_4_,(int)pBVar32);
        pBVar30 = pBVar29;
        pBVar35 = pBVar32;
        pBVar29 = pBVar46;
        if ((int)pBVar38 != 0) goto LAB_00124d0e;
      }
      if ((uint)pBVar29 != 0) {
        uStack_318 = (BaseRAPass *)
                     CONCAT44(uStack_318._4_4_,
                              ~(uStack_31c | (uint)pBVar29 |
                               *(uint *)(*(long *)(&pBVar33->field_0x48 + 0x20) + (long)pBVar31 * 4)
                               | uStack_2ec) & *(uint *)(&pBVar33->_allocator + (long)pBVar31 * 4));
        do {
          pBVar35 = pBVar29;
          uVar19 = 0;
          uVar20 = (uint)pBVar35;
          if (uVar20 != 0) {
            for (; (uVar20 >> uVar19 & 1) == 0; uVar19 = uVar19 + 1) {
            }
          }
          unaff_R15 = (BaseRAPass *)(ulong)uVar19;
          pBVar30 = unaff_R15;
          if ((*(uint *)(*(long *)(&pBVar33->field_0x48 + 0x20) + (long)pBVar31 * 4) >>
               (uVar19 & 0x1f) & 1) == 0) {
            pBVar38 = (BaseRAPass *)0x0;
            pBVar29 = pBVar35;
          }
          else {
            uVar18 = *(uint *)(*(long *)(&pBVar33->field_0x48 + (long)pBVar31 * 8 + 0x28) +
                              (long)unaff_R15 * 4);
            pBVar29 = (BaseRAPass *)(ulong)uVar18;
            pBVar41 = (BaseRAPass *)((ulong)uStack_318 & 0xffffffff);
            if ((uint)uStack_318 == 0) {
              uStack_318 = (BaseRAPass *)((ulong)uStack_318 & 0xffffffff00000000);
            }
            else {
              pcStack_348 = (code *)0x12417a;
              in_R9 = pBStack_2b8;
              uVar21 = decideOnReassignment
                                 ((RALocalAllocator *)pBVar33,(RegGroup)pBVar31,uVar18,uVar19,
                                  (uint)uStack_318,(RAInst *)pBStack_2b8);
              pBVar38 = (BaseRAPass *)0x0;
              if (uVar21 != 0xff) {
                uVar45 = 0;
                if (uVar21 != uVar19) {
                  pBVar41 = (BaseRAPass *)(ulong)uVar19;
                  pcStack_348 = (code *)0x1241c7;
                  RAAssignment::reassign
                            ((RAAssignment *)pBStack_300,(RegGroup)pBVar31,uVar18,uVar21,uVar19);
                  pBVar33 = (BaseRAPass *)(pBStack_330->super_FuncPass).super_Pass._vptr_Pass;
                  pcStack_348 = (code *)0x1241de;
                  uVar45 = (*(pBVar33->super_FuncPass).super_Pass._vptr_Pass[9])
                                     (pBVar33,pBVar29,(ulong)uVar21,(ulong)uVar19);
                }
                pBVar38 = (BaseRAPass *)0x1;
                if (uVar45 != 0) {
                  uStack_33c = uVar45;
                }
                pBVar30 = (BaseRAPass *)(ulong)uStack_33c;
                if (uVar45 == 0) {
                  uStack_318 = (BaseRAPass *)
                               CONCAT44(uStack_318._4_4_,(uint)uStack_318 ^ 1 << (uVar21 & 0x1f));
                  *(uint *)(&pBStack_330->field_0x28 + (long)pBStack_338 * 4) =
                       *(uint *)(&pBStack_330->field_0x28 + (long)pBStack_338 * 4) |
                       1 << ((byte)uVar21 & 0x1f);
                  pBVar38 = (BaseRAPass *)0x1c;
                  pBVar30 = pBStack_330;
                }
              }
              pBVar31 = pBStack_338;
              pBVar40 = pBVar33;
              pBVar44 = pBStack_328;
              pBVar33 = pBStack_330;
              if (uVar21 != 0xff) goto LAB_00124291;
            }
            if ((*(uint *)(*(long *)(&pBVar33->field_0x48 + 0x20) + 0x10 + (long)pBVar31 * 4) &
                1 << ((byte)uVar19 & 0x1f)) == 0) {
LAB_0012425f:
              pcStack_348 = (code *)0x124272;
              pBVar40 = pBStack_300;
              RAAssignment::unassign((RAAssignment *)pBStack_300,(RegGroup)pBVar31,uVar18,uVar19);
              uVar45 = 0;
            }
            else {
              pcStack_348 = (code *)0x124256;
              pBVar40 = pBVar33;
              uVar45 = onSaveReg((RALocalAllocator *)pBVar33,(RegGroup)pBVar31,uVar18,uVar19);
              pBVar31 = pBStack_338;
              if (uVar45 == 0) goto LAB_0012425f;
            }
            pBVar38 = (BaseRAPass *)(ulong)(uVar45 != 0);
            if (uVar45 != 0) {
              uStack_33c = uVar45;
            }
            pBVar30 = (BaseRAPass *)(ulong)uStack_33c;
            pBVar31 = pBStack_338;
            pBVar44 = pBStack_328;
          }
LAB_00124291:
          if (((int)pBVar38 != 0x1c) && ((int)pBVar38 != 0)) goto LAB_001242af;
          uVar20 = uVar20 - 1 & uVar20;
          pBVar29 = (BaseRAPass *)(ulong)uVar20;
        } while (uVar20 != 0);
        pBVar38 = (BaseRAPass *)0x0;
LAB_001242af:
        if ((int)pBVar38 != 0) goto LAB_00124d0e;
      }
      if ((int)pBStack_2f8 != 0) {
        uStack_318 = (BaseRAPass *)(ulong)uStack_2cc;
        pBStack_2e8 = (BaseRAPass *)((ulong)pBStack_2e8 & 0xffffffff00000000);
        pBVar42 = in_R9;
        pBVar43 = unaff_R15;
        do {
          if (uStack_2cc == 0) {
            pBVar50 = (BaseRAPass *)((ulong)pBStack_2f8 & 0xffffffff);
            pBStack_310 = pBVar50;
          }
          else {
            pBVar49 = (BaseRAPass *)0x0;
            pBVar50 = (BaseRAPass *)((ulong)pBStack_2f8 & 0xffffffff);
            pBStack_310 = pBVar50;
            do {
              pBVar38 = (BaseRAPass *)0x25;
              if ((*(byte *)((long)&pBVar44->super_FuncPass + (long)pBVar49 * 0x20 + 9) & 1) == 0) {
                pBVar36 = (BaseRAPass *)((long)&pBVar44->super_FuncPass + (long)pBVar49 * 0x20);
                uVar19 = *(uint *)pBVar36;
                pBVar35 = (BaseRAPass *)(ulong)uVar19;
                if (pBVar35 == (BaseRAPass *)0xffffffff) goto LAB_00124d47;
                if (*(uint *)(&pBVar33->field_0x48 + 0xc) <= uVar19) goto LAB_00124d4c;
                bVar27 = *(byte *)((long)&(pBVar35->super_FuncPass).super_Pass._vptr_Pass +
                                  *(long *)(&pBVar33->field_0x48 + 0x18));
                pBVar43 = (BaseRAPass *)(ulong)bVar27;
                bVar3 = *(undefined1 *)((long)pBVar36 + 0xe);
                pBVar29 = (BaseRAPass *)(ulong)bVar3;
                if (bVar3 == bVar27) goto LAB_00124d51;
                pBVar44 = pBVar33;
                pBVar46 = pBVar29;
                if (0x1f < bVar3) goto LAB_00124d56;
                uVar18 = (uint)bVar3;
                uVar20 = *(uint *)(*(long *)(&pBVar33->field_0x48 + (long)pBVar31 * 8 + 0x28) +
                                  (long)pBVar29 * 4);
                pBVar44 = (BaseRAPass *)(ulong)uVar20;
                uVar45 = (uint)bVar3;
                uVar28 = (uint)bVar27;
                if (pBVar44 != (BaseRAPass *)0xffffffff) {
                  pBVar50 = (BaseRAPass *)(pBVar33->super_FuncPass).super_Pass._vptr_Pass;
                  if (*(uint *)&pBVar50->field_0x148 <= uVar20) goto LAB_00124d5b;
                  RVar17 = (RegGroup)pBStack_338;
                  pBVar30 = pBVar29;
                  if ((uVar28 == 0xff) ||
                     (pcVar8 = (pBStack_330->super_FuncPass).super_Pass._name,
                     bVar4 = *(byte *)((long)(&pBStack_338->_formatOptions + -10) + (long)pcVar8),
                     pBVar30 = (BaseRAPass *)
                               (CONCAT71((int7)((ulong)pcVar8 >> 8),bVar4) & 0xffffffffffffff01),
                     (bVar4 & 1) == 0)) {
                    if (((ulong)pBStack_2e8 & 1) != 0) {
                      uVar18 = ~*(uint *)(*(long *)(&pBStack_330->field_0x48 + 0x20) +
                                         (long)pBStack_338 * 4) &
                               *(uint *)(&pBStack_330->_allocator + (long)pBStack_338 * 4);
                      if (uVar18 == 0) {
                        if ((*(uint *)(*(long *)(&pBStack_330->field_0x48 + 0x20) + 0x10 +
                                      (long)pBStack_338 * 4) >> (uVar45 & 0x1f) & 1) == 0) {
LAB_0012457b:
                          pcStack_348 = (code *)0x12458e;
                          pBVar40 = pBStack_300;
                          RAAssignment::unassign
                                    ((RAAssignment *)pBStack_300,(RegGroup)pBStack_338,uVar20,uVar45
                                    );
                          pBVar50 = (BaseRAPass *)0x0;
                        }
                        else {
                          pcStack_348 = (code *)0x124572;
                          pBVar40 = pBStack_330;
                          EVar23 = onSaveReg((RALocalAllocator *)pBStack_330,RVar17,uVar20,uVar45);
                          pBVar50 = (BaseRAPass *)(ulong)EVar23;
                          if (EVar23 == 0) goto LAB_0012457b;
                        }
                        bVar53 = (int)pBVar50 != 0;
                        pBVar38 = (BaseRAPass *)(ulong)bVar53;
                        pBVar30 = (BaseRAPass *)(ulong)uStack_33c;
                        if (bVar53) {
                          pBVar30 = pBVar50;
                        }
                        uStack_33c = (uint)pBVar30;
                      }
                      else {
                        uVar20 = ~*(uint *)(&pBStack_330->field_0x38 + (long)pBStack_338 * 4) &
                                 uVar18;
                        if (uVar20 == 0) {
                          uVar20 = uVar18;
                        }
                        uVar18 = 0;
                        if (uVar20 != 0) {
                          for (; (uVar20 >> uVar18 & 1) == 0; uVar18 = uVar18 + 1) {
                          }
                        }
                        uVar20 = 0;
                        if (uVar18 != uVar28) {
                          pBVar41 = (BaseRAPass *)(ulong)uVar28;
                          pcStack_348 = (code *)0x124457;
                          RAAssignment::reassign
                                    ((RAAssignment *)pBStack_300,RVar17,uVar19,uVar18,uVar28);
                          pBVar40 = (BaseRAPass *)
                                    (pBStack_330->super_FuncPass).super_Pass._vptr_Pass;
                          pcStack_348 = (code *)0x12446d;
                          uVar20 = (*(pBVar40->super_FuncPass).super_Pass._vptr_Pass[9])
                                             (pBVar40,pBVar35,(ulong)uVar18,(ulong)(uint)bVar27);
                        }
                        pBVar50 = (BaseRAPass *)(ulong)uVar20;
                        pBVar38 = (BaseRAPass *)0x1;
                        pBVar30 = (BaseRAPass *)(ulong)uStack_33c;
                        if (uVar20 != 0) {
                          pBVar30 = pBVar50;
                        }
                        uStack_33c = (uint)pBVar30;
                        if (uVar20 == 0) {
                          pBVar30 = (BaseRAPass *)(ulong)uVar18;
                          uVar20 = 1 << ((byte)uVar18 & 0x1f);
                          pBVar50 = (BaseRAPass *)(ulong)uVar20;
                          *(uint *)(&pBStack_330->field_0x28 + (long)pBStack_338 * 4) =
                               *(uint *)(&pBStack_330->field_0x28 + (long)pBStack_338 * 4) | uVar20;
                          pBVar38 = (BaseRAPass *)0x23;
                        }
                      }
                    }
                  }
                  else {
                    uStack_2e0 = *(uint32_t **)(*(long *)&pBVar50->_workRegs + (long)pBVar44 * 8);
                    pBVar42 = (BaseRAPass *)(ulong)uVar18;
                    pcStack_348 = (code *)0x1243bc;
                    RAAssignment::swap((RAAssignment *)pBStack_300,RVar17,uVar19,uVar28,uVar20,
                                       uVar18);
                    pBVar40 = (BaseRAPass *)(pBStack_330->super_FuncPass).super_Pass._vptr_Pass;
                    pBVar41 = (BaseRAPass *)(ulong)uVar18;
                    pcStack_348 = (code *)0x1243d5;
                    uVar20 = (*(pBVar40->super_FuncPass).super_Pass._vptr_Pass[10])
                                       (pBVar40,pBVar35,(ulong)uVar28,pBVar44);
                    pBVar50 = (BaseRAPass *)(ulong)uVar20;
                    pBVar38 = (BaseRAPass *)0x1;
                    if (uVar20 != 0) {
                      uStack_33c = uVar20;
                    }
                    pBVar30 = (BaseRAPass *)(ulong)uStack_33c;
                    if (uVar20 == 0) {
                      uVar20 = *(uint *)((long)pBVar36 + 8);
                      *(uint *)((long)pBVar36 + 8) = uVar20 | 0x100;
                      if ((uVar20 & 2) != 0) {
                        puVar39 = (uint *)(*(long *)(&pBStack_330->field_0x48 + 0x20) + 0x10 +
                                          (long)pBStack_338 * 4);
                        *puVar39 = *puVar39 | 1 << (bVar3 & 0x1f);
                      }
                      iVar22 = (int)pBStack_310;
                      pBVar50 = (BaseRAPass *)(ulong)(iVar22 - 1);
                      pBVar30 = pBStack_328;
                      pBVar33 = uStack_318;
                      do {
                        if (*(uint32_t *)&(pBVar30->super_FuncPass).super_Pass._vptr_Pass ==
                            *uStack_2e0) goto LAB_00124501;
                        pBVar30 = (BaseRAPass *)&pBVar30->field_0x20;
                        pBVar33 = (BaseRAPass *)&pBVar33[-1].field_0x4af;
                      } while (pBVar33 != (BaseRAPass *)0x0);
                      pBVar30 = (BaseRAPass *)0x0;
LAB_00124501:
                      pBVar38 = (BaseRAPass *)0x25;
                      pBStack_310 = pBVar50;
                      if ((pBVar30 != (BaseRAPass *)0x0) &&
                         (*(undefined1 *)((long)&(pBVar30->super_FuncPass).super_Pass._cb + 6) ==
                          bVar27)) {
                        uVar20 = *(uint *)&(pBVar30->super_FuncPass).super_Pass._cb;
                        *(uint *)&(pBVar30->super_FuncPass).super_Pass._cb = uVar20 | 0x100;
                        if ((uVar20 & 2) != 0) {
                          pBVar30 = *(BaseRAPass **)(&pBStack_330->field_0x48 + 0x20);
                          puVar39 = (uint *)((long)(&pBVar30->_formatOptions + -10) +
                                            (long)pBStack_338 * 4);
                          *puVar39 = *puVar39 | 1 << (bVar27 & 0x1f);
                        }
                        pBVar50 = (BaseRAPass *)(ulong)(iVar22 - 2);
                        pBStack_310 = pBVar50;
                      }
                    }
                  }
                  pBVar31 = pBStack_338;
                  pBVar44 = pBStack_328;
                  pBVar33 = pBStack_330;
                  if ((int)pBVar38 != 0) goto LAB_0012466a;
                }
                if (bVar27 == 0xff) {
                  pBVar41 = (BaseRAPass *)0x0;
                  pcStack_348 = (code *)0x1245fe;
                  RAAssignment::assign
                            ((RAAssignment *)pBStack_300,(RegGroup)pBStack_338,uVar19,uVar45,false);
                  pBVar40 = (BaseRAPass *)(pBVar33->super_FuncPass).super_Pass._vptr_Pass;
                  pcStack_348 = (code *)0x12460d;
                  uVar19 = (*(pBVar40->super_FuncPass).super_Pass._vptr_Pass[0xb])
                                     (pBVar40,pBVar35,(ulong)uVar45);
                }
                else {
                  pBVar41 = (BaseRAPass *)(ulong)uVar28;
                  pcStack_348 = (code *)0x1245d8;
                  RAAssignment::reassign
                            ((RAAssignment *)pBStack_300,(RegGroup)pBStack_338,uVar19,uVar45,uVar28)
                  ;
                  pBVar40 = (BaseRAPass *)(pBVar33->super_FuncPass).super_Pass._vptr_Pass;
                  pcStack_348 = (code *)0x1245ea;
                  uVar19 = (*(pBVar40->super_FuncPass).super_Pass._vptr_Pass[9])
                                     (pBVar40,pBVar35,(ulong)uVar45,(ulong)uVar28);
                }
                pBVar50 = (BaseRAPass *)(ulong)uVar19;
                pBVar38 = (BaseRAPass *)0x1;
                if (uVar19 != 0) {
                  uStack_33c = uVar19;
                }
                pBVar30 = (BaseRAPass *)(ulong)uStack_33c;
                pBVar31 = pBStack_338;
                pBVar44 = pBStack_328;
                if (uVar19 == 0) {
                  uVar19 = *(uint *)((long)pBVar36 + 8);
                  uVar20 = uVar19 | 0x100;
                  pBVar30 = (BaseRAPass *)(ulong)uVar20;
                  *(uint *)((long)pBVar36 + 8) = uVar20;
                  if ((uVar19 & 2) != 0) {
                    pBVar30 = *(BaseRAPass **)(&pBVar33->field_0x48 + 0x20);
                    puVar39 = (uint *)((long)(&pBVar30->_formatOptions + -10) +
                                      (long)pBStack_338 * 4);
                    *puVar39 = *puVar39 | 1 << (bVar3 & 0x1f);
                  }
                  pBVar50 = (BaseRAPass *)(ulong)((int)pBStack_310 - 1);
                  pBVar38 = (BaseRAPass *)0x0;
                  pBStack_310 = pBVar50;
                }
              }
LAB_0012466a:
              iVar22 = (int)pBVar38;
              if ((iVar22 != 0) && (iVar22 != 0x25)) {
                if (iVar22 != 0x23) {
                  pBStack_2f8 = (BaseRAPass *)CONCAT44(pBStack_2f8._4_4_,(int)pBStack_310);
                  in_R9 = pBVar42;
                  unaff_R15 = pBVar43;
                  goto LAB_001246a9;
                }
                break;
              }
              pBVar49 = (BaseRAPass *)((long)&(pBVar49->super_FuncPass).super_Pass._vptr_Pass + 1);
            } while (pBVar49 != uStack_318);
          }
          pBStack_2e8 = (BaseRAPass *)
                        CONCAT44(pBStack_2e8._4_4_,
                                 (int)CONCAT71((int7)((ulong)pBVar50 >> 8),
                                               (int)pBStack_2f8 == (int)pBStack_310));
          pBVar38 = (BaseRAPass *)0x0;
          pBStack_2f8 = (BaseRAPass *)CONCAT44(pBStack_2f8._4_4_,(int)pBStack_310);
          pBVar30 = pBStack_310;
          in_R9 = pBVar42;
          unaff_R15 = pBVar43;
LAB_001246a9:
          if ((int)pBVar38 != 0) goto LAB_001246d1;
          pBVar42 = in_R9;
          pBVar43 = unaff_R15;
        } while ((int)pBStack_2f8 != 0);
        pBVar38 = (BaseRAPass *)0x0;
LAB_001246d1:
        if ((int)pBVar38 != 0) goto LAB_00124d0e;
      }
      if (uStack_304 == 0) {
        pBVar36 = (BaseRAPass *)0x0;
        pBVar50 = (BaseRAPass *)(ulong)uStack_2ec;
        pBVar42 = pBVar29;
      }
      else {
        unaff_R15 = (BaseRAPass *)(ulong)uStack_304;
        pBVar33 = (BaseRAPass *)0x0;
        pBVar36 = (BaseRAPass *)(ulong)uStack_304;
        pBVar50 = (BaseRAPass *)(ulong)uStack_2ec;
        do {
          pBVar42 = (BaseRAPass *)auStack_270[(long)pBVar33];
          uVar19 = *(uint *)&(pBVar42->super_FuncPass).super_Pass._vptr_Pass;
          if ((ulong)uVar19 == 0xffffffff) goto LAB_00124d7e;
          pBVar29 = pBVar30;
          if (*(uint *)(&pBStack_330->field_0x48 + 0xc) <= uVar19) goto LAB_00124d83;
          bVar27 = *(byte *)(*(long *)(&pBStack_330->field_0x48 + 0x18) + (ulong)uVar19);
          pBVar35 = (BaseRAPass *)(ulong)bVar27;
          uVar20 = (uint)bVar27;
          if (uVar20 != 0xff) {
            pBVar38 = (BaseRAPass *)((ulong)pBStack_338 & 0xff);
            pBVar30 = (BaseRAPass *)(ulong)uVar20;
            pcStack_348 = (code *)0x124737;
            pBVar40 = pBStack_300;
            RAAssignment::unassign((RAAssignment *)pBStack_300,(RegGroup)pBStack_338,uVar19,uVar20);
            pBVar50 = (BaseRAPass *)(ulong)((uint)pBVar50 & ~(1 << (bVar27 & 0x1f)));
          }
          pBVar36 = (BaseRAPass *)
                    (ulong)((int)pBVar36 + -1 +
                           (uint)((*(uint *)&(pBVar42->super_FuncPass).super_Pass._cb >> 3 & 1) != 0
                                 ));
          pBVar33 = (BaseRAPass *)((long)&(pBVar33->super_FuncPass).super_Pass._vptr_Pass + 1);
        } while (unaff_R15 != pBVar33);
      }
      pBVar33 = pBStack_330;
      pBVar31 = pBStack_338;
      if ((int)pBVar50 != 0) {
        do {
          uVar19 = 0;
          uVar20 = (uint)pBVar50;
          if (uVar20 != 0) {
            for (; (uVar20 >> uVar19 & 1) == 0; uVar19 = uVar19 + 1) {
            }
          }
          uVar18 = *(uint *)(*(long *)(&pBVar33->field_0x48 + (long)pBVar31 * 8 + 0x28) +
                            (ulong)uVar19 * 4);
          unaff_R15 = (BaseRAPass *)(ulong)uVar18;
          if (uVar18 == 0xffffffff) {
            pBVar38 = (BaseRAPass *)0x38;
          }
          else {
            if ((*(uint *)(*(long *)(&pBVar33->field_0x48 + 0x20) + 0x10 + (long)pBVar31 * 4) >>
                 (uVar19 & 0x1f) & 1) == 0) {
LAB_001247a4:
              pcStack_348 = (code *)0x1247b6;
              pBVar40 = pBStack_300;
              RAAssignment::unassign((RAAssignment *)pBStack_300,(RegGroup)pBVar31,uVar18,uVar19);
              uVar45 = 0;
            }
            else {
              pcStack_348 = (code *)0x12479b;
              pBVar40 = pBVar33;
              uVar45 = onSaveReg((RALocalAllocator *)pBVar33,(RegGroup)pBVar31,uVar18,uVar19);
              pBVar31 = pBStack_338;
              if (uVar45 == 0) goto LAB_001247a4;
            }
            pBVar38 = (BaseRAPass *)(ulong)(uVar45 != 0);
            if (uVar45 != 0) {
              uStack_33c = uVar45;
            }
            pBVar30 = (BaseRAPass *)(ulong)uStack_33c;
            pBVar31 = pBStack_338;
          }
          if (((int)pBVar38 != 0x38) && ((int)pBVar38 != 0)) goto LAB_001247f2;
          uVar20 = uVar20 - 1 & uVar20;
          pBVar50 = (BaseRAPass *)(ulong)uVar20;
        } while (uVar20 != 0);
        pBVar38 = (BaseRAPass *)0x0;
LAB_001247f2:
        if ((int)pBVar38 != 0) goto LAB_00124d0e;
      }
      if ((int)uStack_2d8 != 0) {
        uVar34 = (ulong)uStack_2d8 & 0xffffffff;
        uVar47 = 0;
        do {
          puVar39 = (uint *)auStack_170[uVar47];
          pBVar42 = (BaseRAPass *)(ulong)puVar39[4];
          if (puVar39[4] != 0) {
            uVar19 = *puVar39;
            bVar27 = *(byte *)((long)puVar39 + 0xe);
            unaff_R15 = (BaseRAPass *)(ulong)bVar27;
            do {
              uVar20 = 0;
              uVar18 = (uint)pBVar42;
              if (uVar18 != 0) {
                for (; (uVar18 >> uVar20 & 1) == 0; uVar20 = uVar20 + 1) {
                }
              }
              if (uVar20 != bVar27) {
                pBVar40 = (BaseRAPass *)(pBStack_330->super_FuncPass).super_Pass._vptr_Pass;
                pBVar38 = (BaseRAPass *)(ulong)uVar19;
                pBVar30 = (BaseRAPass *)(ulong)(uint)bVar27;
                pcStack_348 = (code *)0x12483c;
                (*(pBVar40->super_FuncPass).super_Pass._vptr_Pass[9])();
              }
              uVar18 = uVar18 - 1 & uVar18;
              pBVar42 = (BaseRAPass *)(ulong)uVar18;
            } while (uVar18 != 0);
          }
          uVar47 = uVar47 + 1;
        } while (uVar47 != uVar34);
      }
      pBVar31 = pBStack_338;
      if ((pBStack_338 == (BaseRAPass *)0x1) &&
         (pBVar30 = pBStack_280, *(char *)&(pBStack_280->super_FuncPass).super_Pass._name == '\x12')
         ) {
        uVar19 = *(uint *)(*(long *)(&pBStack_330->field_0x48 + 0x20) + 4) &
                 *(uint *)&pBStack_280->_extraBlock;
        if (uVar19 == 0) {
          pBVar30 = (BaseRAPass *)CONCAT71((int7)((ulong)pBStack_280 >> 8),1);
        }
        else {
          bVar27 = *(byte *)((long)(((RAAssignment *)&pBStack_280->field_0x48)->_physToWorkIds).
                                   _data + 0x1d);
          pBVar33 = (BaseRAPass *)(ulong)bVar27;
          do {
            pBVar50 = (BaseRAPass *)(ulong)uVar19;
            uVar20 = 0;
            if (uVar19 != 0) {
              for (; (uVar19 >> uVar20 & 1) == 0; uVar20 = uVar20 + 1) {
              }
            }
            pBVar32 = (BaseRAPass *)(ulong)uVar20;
            uVar18 = *(uint *)(*(long *)(&pBStack_330->field_0x48 + (long)pBVar31 * 8 + 0x28) +
                              (long)pBVar32 * 4);
            unaff_R15 = (BaseRAPass *)(ulong)uVar18;
            pp_Var7 = (pBStack_330->super_FuncPass).super_Pass._vptr_Pass;
            pBVar29 = pBStack_330;
            if (*(uint *)(pp_Var7 + 0x29) <= uVar18) goto LAB_00124d9c;
            pBVar30 = (BaseRAPass *)CONCAT71((int7)((ulong)pBStack_330 >> 8),1);
            if ((uint)bVar27 <
                *(uint *)(*(long *)(*(long *)(pp_Var7[0x28] + (long)unaff_R15 * 8) + 8) + 8)) {
              if ((*(uint *)(*(long *)(&pBStack_330->field_0x48 + 0x20) + 0x10 + (long)pBVar31 * 4)
                   >> (uVar20 & 0x1f) & 1) == 0) {
LAB_001248f9:
                pBVar38 = (BaseRAPass *)0x1;
                pcStack_348 = (code *)0x12490d;
                pBVar40 = pBStack_300;
                RAAssignment::unassign((RAAssignment *)pBStack_300,kVec,uVar18,uVar20);
                uVar45 = 0;
                pBVar31 = pBVar32;
              }
              else {
                pBVar38 = (BaseRAPass *)0x1;
                pBVar31 = (BaseRAPass *)(ulong)uVar20;
                pcStack_348 = (code *)0x1248f5;
                pBVar40 = pBStack_330;
                uVar45 = onSaveReg((RALocalAllocator *)pBStack_330,kVec,uVar18,uVar20);
                if (uVar45 == 0) goto LAB_001248f9;
              }
              pBVar30 = (BaseRAPass *)CONCAT71((int7)((ulong)pBVar31 >> 8),uVar45 == 0);
              pBVar31 = pBStack_338;
              if (uVar45 != 0) {
                uStack_33c = uVar45;
              }
            }
            if ((char)pBVar30 == '\0') {
              pBVar30 = (BaseRAPass *)0x0;
              break;
            }
            uVar19 = uVar19 - 1 & uVar19;
          } while (uVar19 != 0);
        }
        pBVar38 = (BaseRAPass *)0x1;
        pBVar33 = pBStack_330;
        if ((char)pBVar30 == '\0') goto LAB_00124d0e;
      }
      uStack_2ec = uStack_2ec | uStack_31c;
      pBVar44 = pBStack_330;
      if ((int)pBVar36 == 0) {
LAB_00124d03:
        *(uint *)(&pBVar44->field_0x28 + (long)pBVar31 * 4) =
             *(uint *)(&pBVar44->field_0x28 + (long)pBVar31 * 4) | uStack_2ec;
        pBVar38 = (BaseRAPass *)0x0;
        pBVar33 = pBVar44;
        goto LAB_00124d0e;
      }
      uVar19 = *(uint *)(*(long *)(&pBStack_330->field_0x48 + 0x20) + (long)pBVar31 * 4);
      pBVar38 = (BaseRAPass *)(ulong)uVar19;
      iVar22 = (int)pBStack_2c8;
      pBStack_328 = (BaseRAPass *)CONCAT44(pBStack_328._4_4_,uVar19);
      pBVar50 = pBStack_2c8;
      if (iVar22 != 0) {
        pBVar30 = (BaseRAPass *)CONCAT71((int7)((ulong)pBVar30 >> 8),1);
        if ((*(char *)(auStack_2b0._16_8_ + 9) & 8U) != 0) {
          uVar19 = *(uint *)(auStack_2b0._16_8_ + 0x14);
          if (uVar19 == 0) {
            unaff_R15 = (BaseRAPass *)0xffffffff;
          }
          else {
            lVar37 = (long)pBVar31 * 4;
            pBVar38 = (BaseRAPass *)(ulong)*(uint *)(&pBStack_330->_allocator + lVar37);
            pBVar40 = (BaseRAPass *)(pBStack_330->super_FuncPass).super_Pass._vptr_Pass;
            pBVar41 = (BaseRAPass *)((ulong)pBStack_2c8 & 0xffffffff);
            in_R9 = (BaseRAPass *)0x0;
            unaff_R15 = (BaseRAPass *)0xffffffff;
            uVar20 = uVar19;
            do {
              uVar18 = 0;
              if (uVar20 != 0) {
                for (; (uVar20 >> uVar18 & 1) == 0; uVar18 = uVar18 + 1) {
                }
              }
              if ((uVar19 >> (uVar18 & 0x1f) & 1) != 0) {
                uVar45 = (uint)unaff_R15;
                uStack_318 = (BaseRAPass *)CONCAT44(uStack_318._4_4_,uVar45);
                pBVar29 = (BaseRAPass *)(ulong)uVar18;
                pBVar35 = (BaseRAPass *)0xf;
                unaff_R15 = (BaseRAPass *)(auStack_2b0 + 0x10);
                pBVar50 = (BaseRAPass *)0x1;
                do {
                  uVar28 = 1 << ((byte)pBVar29 & 0x1f) &
                           *(uint *)(&pBStack_330->_allocator + lVar37);
                  pBVar33 = (BaseRAPass *)(ulong)uVar28;
                  if (uVar28 == 0) {
                    pBVar35 = (BaseRAPass *)0x0;
                  }
                  else {
                    uVar48 = *(uint *)(unaff_R15->super_FuncPass).super_Pass._vptr_Pass;
                    pBVar42 = (BaseRAPass *)(ulong)uVar48;
                    if (*(uint *)&pBVar40->field_0x148 <= uVar48) goto LAB_00124d88;
                    bVar53 = pBVar29 ==
                             (BaseRAPass *)
                             (ulong)*(byte *)(*(long *)(*(long *)&pBVar40->_workRegs +
                                                       (long)pBVar42 * 8) + 0x4a);
                    pBVar42 = (BaseRAPass *)(ulong)bVar53;
                    pBVar35 = (BaseRAPass *)(ulong)((int)pBVar35 + (uint)bVar53);
                    pBVar31 = pBStack_338;
                  }
                  if (uVar28 == 0) break;
                  unaff_R15 = (BaseRAPass *)&(unaff_R15->super_FuncPass).super_Pass._cb;
                  pBVar29 = (BaseRAPass *)((long)&((RALocalAllocator *)pBVar29)->_pass + 1);
                  bVar53 = pBVar50 < pBVar41;
                  pBVar31 = pBStack_338;
                  pBVar50 = (BaseRAPass *)
                            ((long)&(pBVar50->super_FuncPass).super_Pass._vptr_Pass + 1);
                } while (bVar53);
                if ((uint)in_R9 < (uint)pBVar35) {
                  uVar45 = uVar18;
                  in_R9 = pBVar35;
                }
                unaff_R15 = (BaseRAPass *)(ulong)uVar45;
              }
              uVar20 = uVar20 - 1 & uVar20;
              pBVar30 = (BaseRAPass *)(ulong)uVar20;
            } while (uVar20 != 0);
          }
          iVar51 = (int)unaff_R15;
          pBVar30 = (BaseRAPass *)CONCAT71((int7)((ulong)pBVar30 >> 8),iVar51 != -1);
          if (iVar51 == -1) {
            uStack_33c = 0x3d;
            pBVar50 = pBStack_2c8;
          }
          else {
            pBVar50 = (BaseRAPass *)(ulong)(iVar22 + (uint)(iVar22 == 0));
            pBVar33 = (BaseRAPass *)0x0;
            do {
              uVar19 = iVar51 + (int)pBVar33;
              pBVar40 = (BaseRAPass *)(ulong)uVar19;
              *(char *)(*(long *)(auStack_2b0 + (long)pBVar33 * 8 + 0x10) + 0xf) = (char)uVar19;
              pBVar33 = (BaseRAPass *)((long)&(pBVar33->super_FuncPass).super_Pass._vptr_Pass + 1);
              pBVar31 = pBStack_338;
            } while (pBVar50 != pBVar33);
          }
        }
        pBVar38 = (BaseRAPass *)0x1;
        if ((char)pBVar30 != '\0') goto LAB_00124ade;
LAB_00124cff:
        pBVar33 = pBVar44;
        if ((int)pBVar38 != 0) goto LAB_00124d0e;
        goto LAB_00124d03;
      }
LAB_00124ade:
      pBVar29 = (BaseRAPass *)(ulong)uStack_304;
      if (uStack_304 == 0) {
        bVar53 = false;
        uStack_318 = (BaseRAPass *)((ulong)uStack_318._4_4_ << 0x20);
        pBVar33 = pBStack_330;
      }
      else {
        pBVar42 = (BaseRAPass *)0x0;
        uStack_318 = (BaseRAPass *)((ulong)uStack_318._4_4_ << 0x20);
        pBVar35 = pBVar29;
        uStack_2d8 = pBVar29;
        do {
          pBVar50 = (BaseRAPass *)auStack_270[(long)pBVar42];
          uVar19 = *(uint *)&(pBVar50->super_FuncPass).super_Pass._cb;
          pBVar33 = (BaseRAPass *)(ulong)uVar19;
          pBVar38 = (BaseRAPass *)0x4e;
          pBVar44 = pBStack_330;
          if ((uVar19 & 8) != 0) {
            uVar20 = *(uint *)&(pBVar50->super_FuncPass).super_Pass._vptr_Pass;
            pBVar35 = (BaseRAPass *)(ulong)uVar20;
            if (pBVar35 == (BaseRAPass *)0xffffffff) goto LAB_00124da6;
            if (*(uint *)(&pBStack_330->field_0x48 + 0xc) <= uVar20) goto LAB_00124dab;
            bVar27 = *(byte *)((long)&(pBVar35->super_FuncPass).super_Pass._vptr_Pass +
                              *(long *)(&pBStack_330->field_0x48 + 0x18));
            pBVar32 = (BaseRAPass *)(ulong)bVar27;
            if (bVar27 != 0xff) {
              pBVar38 = (BaseRAPass *)((ulong)pBVar31 & 0xff);
              pcStack_348 = (code *)0x124b57;
              pBVar40 = pBStack_300;
              RAAssignment::unassign
                        ((RAAssignment *)pBStack_300,(RegGroup)pBVar31,uVar20,(uint)bVar27);
              pBVar31 = pBStack_338;
            }
            pBVar33 = pBStack_330;
            bVar27 = *(undefined1 *)((long)&(pBVar50->super_FuncPass).super_Pass._cb + 7);
            unaff_R15 = (BaseRAPass *)(ulong)bVar27;
            pBVar30 = unaff_R15;
            if (bVar27 == 0xff) {
              uVar19 = ~((int)(short)uVar19 >> 0xf & uStack_31c | (uint)uStack_318) &
                       *(uint *)((long)&(pBVar50->super_FuncPass).super_Pass._name + 4);
              uVar47 = (ulong)uVar19;
              uVar18 = ~(uint)pBStack_328 & uVar19;
              pBVar41 = (BaseRAPass *)(ulong)uVar18;
              pBVar40 = pBStack_330;
              if (uVar18 == 0) {
                pBVar30 = (BaseRAPass *)(ulong)(uVar19 & (uint)pBStack_328);
                pBVar38 = (BaseRAPass *)((ulong)pBVar31 & 0xff);
                pBStack_310 = (BaseRAPass *)CONCAT44(pBStack_310._4_4_,(int)pBVar38);
                pBVar41 = (BaseRAPass *)auStack_2b0;
                pcStack_348 = (code *)0x124bd2;
                uVar21 = decideOnSpillFor((RALocalAllocator *)pBStack_330,(RegGroup)pBVar31,
                                          (uint32_t)pBVar31,uVar19 & (uint)pBStack_328,
                                          (uint32_t *)pBVar41);
                workId = auStack_2b0._0_4_;
                if (0x1f < uVar21) goto LAB_00124dba;
                unaff_R15 = (BaseRAPass *)(ulong)uVar21;
                RVar17 = (RegGroup)pBStack_310;
                if ((*(uint *)(*(long *)(&pBVar33->field_0x48 + 0x20) + 0x10 + (long)pBStack_338 * 4
                              ) >> (uVar21 & 0x1f) & 1) == 0) {
LAB_00124c1c:
                  pcStack_348 = (code *)0x124c29;
                  pBVar33 = unaff_R15;
                  pBVar40 = pBStack_300;
                  RAAssignment::unassign((RAAssignment *)pBStack_300,RVar17,workId,uVar21);
                  uVar19 = 0;
                }
                else {
                  pBVar33 = (BaseRAPass *)(ulong)uVar21;
                  pcStack_348 = (code *)0x124c11;
                  pBVar40 = pBStack_330;
                  uVar19 = onSaveReg((RALocalAllocator *)pBStack_330,RVar17,auStack_2b0._0_4_,uVar21
                                    );
                  RVar17 = (RegGroup)pBStack_310;
                  if (uVar19 == 0) goto LAB_00124c1c;
                }
                pBVar32 = (BaseRAPass *)CONCAT71((int7)((ulong)pBVar33 >> 8),uVar19 == 0);
                pBVar33 = pBStack_330;
                if (uVar19 != 0) {
                  uStack_33c = uVar19;
                }
              }
              else {
                pcStack_348 = (code *)0x124baa;
                uVar21 = decideOnAssignment((RALocalAllocator *)pBStack_330,(RegGroup)pBVar31,uVar20
                                            ,uVar19,uVar18);
                unaff_R15 = (BaseRAPass *)(ulong)uVar21;
                pBVar32 = (BaseRAPass *)CONCAT71((int7)(uVar47 >> 8),1);
              }
              pBVar38 = (BaseRAPass *)0x1;
              pBVar29 = uStack_2d8;
              pBVar31 = pBStack_338;
              pBVar44 = pBVar33;
              pBVar30 = unaff_R15;
              if ((char)pBVar32 == '\0') goto LAB_00124cbe;
            }
            uVar19 = (uint)pBVar30;
            pBVar29 = pBVar32;
            unaff_R15 = pBVar30;
            if (0x1f < uVar19) goto LAB_00124db0;
            puVar16 = &pBVar33->field_0x48;
            uVar18 = 1 << ((byte)pBVar30 & 0x1f);
            pBVar33 = (BaseRAPass *)(ulong)uVar18;
            if ((*(uint *)(*(long *)(puVar16 + 0x20) + (long)pBVar31 * 4) >> (uVar19 & 0x1f) & 1) !=
                0) goto LAB_00124db5;
            if (((ulong)(pBVar50->super_FuncPass).super_Pass._cb & 0x40000) == 0) {
              pBVar41 = (BaseRAPass *)0x1;
              pcStack_348 = (code *)0x124c95;
              pBVar40 = pBStack_300;
              RAAssignment::assign((RAAssignment *)pBStack_300,(RegGroup)pBVar31,uVar20,uVar19,true)
              ;
              pBVar31 = pBStack_338;
            }
            *(byte *)((long)&(pBVar50->super_FuncPass).super_Pass._cb + 7) = (byte)pBVar30;
            puVar16 = (undefined1 *)((long)&(pBVar50->super_FuncPass).super_Pass._cb + 1);
            *puVar16 = *puVar16 | 2;
            uStack_318 = (BaseRAPass *)CONCAT44(uStack_318._4_4_,(uint)uStack_318 | uVar18);
            pBStack_328 = (BaseRAPass *)CONCAT44(pBStack_328._4_4_,(uint)pBStack_328 & ~uVar18);
            pBVar36 = (BaseRAPass *)(ulong)((int)pBVar36 - 1);
            pBVar38 = (BaseRAPass *)0x0;
            pBVar29 = uStack_2d8;
            pBVar44 = pBStack_330;
          }
LAB_00124cbe:
          if (((int)pBVar38 != 0x4e) && ((int)pBVar38 != 0)) goto LAB_00124cff;
          pBVar42 = (BaseRAPass *)((long)&(pBVar42->super_FuncPass).super_Pass._vptr_Pass + 1);
        } while (pBVar29 != pBVar42);
        bVar53 = (int)pBVar36 == 0;
        pBVar30 = pBVar29;
        pBVar29 = pBVar35;
        pBVar33 = pBVar44;
      }
      pBVar36 = (BaseRAPass *)0x0;
      pBVar35 = pBVar29;
      if (bVar53) {
        uStack_2ec = uStack_2ec | (uint)uStack_318;
        pBVar38 = (BaseRAPass *)0x0;
        pBVar44 = pBVar33;
        goto LAB_00124cff;
      }
      goto LAB_00124dbf;
    }
    pBVar38 = (BaseRAPass *)0x1;
    if ((uVar20 + 1 & uVar20) == 0) {
      uVar18 = 0;
      if (~uVar20 != 0) {
        for (; (~uVar20 >> uVar18 & 1) == 0; uVar18 = uVar18 + 1) {
        }
      }
      pBStack_2c8 = (BaseRAPass *)(ulong)uVar18;
      pBVar40 = (BaseRAPass *)CONCAT71((int7)((ulong)pBVar40 >> 8),1);
      pBVar29 = pBStack_2c8;
      if ((*(char *)(auStack_2b0._16_8_ + 9) & 4U) != 0) {
        uVar20 = *(uint *)(&pBVar33->_allocator + (long)pBVar31 * 4) | (uint)pBVar42;
        pBVar40 = (BaseRAPass *)(ulong)uVar20;
        pBVar41 = (BaseRAPass *)(ulong)uVar18;
        if (uVar18 != 0) {
          uVar45 = *(uint *)(&pBVar33->field_0x48 + 0xc);
          pBVar29 = (BaseRAPass *)(ulong)uVar45;
          in_R9 = *(BaseRAPass **)(&pBVar33->field_0x48 + 0x18);
          pBVar43 = (BaseRAPass *)0x0;
          do {
            uVar28 = **(uint **)(auStack_2b0 + (long)pBVar43 * 8 + 0x10);
            pBVar49 = pBVar50;
            if ((ulong)uVar28 == 0xffffffff) goto LAB_00124d6a;
            pBVar30 = pBVar29;
            pBVar35 = pBVar32;
            if (uVar45 <= uVar28) goto LAB_00124d6f;
            *(uint *)(auStack_2b0 + (long)pBVar43 * 4) =
                 (uint)*(byte *)((long)&(in_R9->super_FuncPass).super_Pass._vptr_Pass +
                                (ulong)uVar28);
            pBVar43 = (BaseRAPass *)((long)&(pBVar43->super_FuncPass).super_Pass._vptr_Pass + 1);
          } while (pBVar41 != pBVar43);
        }
        uStack_308 = (uint)pBVar32;
        uVar45 = *(uint *)(uVar13 + 0x10);
        if (uVar45 == 0) {
          ppBVar24 = (BaseRAPass **)0xffffffff;
        }
        else {
          uVar20 = uVar20 & ~uStack_31c;
          pBVar40 = (BaseRAPass *)(ulong)uVar20;
          pp_Var7 = (pBVar33->super_FuncPass).super_Pass._vptr_Pass;
          ppBVar24 = (BaseRAPass **)0xffffffff;
          pBVar46 = (BaseRAPass *)0x0;
          pBStack_2e8 = (BaseRAPass *)CONCAT44(pBStack_2e8._4_4_,uVar45);
          uVar28 = uVar45;
          do {
            pBVar35 = (BaseRAPass *)(ulong)uVar28;
            uVar48 = 0;
            if (uVar28 != 0) {
              for (; (uVar28 >> uVar48 & 1) == 0; uVar48 = uVar48 + 1) {
              }
            }
            pBVar36 = (BaseRAPass *)(ulong)uVar48;
            if ((uVar45 >> (uVar48 & 0x1f) & 1) != 0) {
              if (uVar18 == 0) {
                pBVar49 = (BaseRAPass *)0xf;
              }
              else {
                pBVar30 = (BaseRAPass *)(ulong)uVar48;
                pBVar49 = (BaseRAPass *)0xf;
                pBVar33 = (BaseRAPass *)0x0;
                pBVar43 = (BaseRAPass *)0x1;
                do {
                  uVar48 = 1 << ((byte)pBVar30 & 0x1f) & uVar20;
                  pBVar29 = (BaseRAPass *)(ulong)uVar48;
                  if (uVar48 == 0) {
                    pBVar49 = (BaseRAPass *)0x0;
                  }
                  else {
                    if (*(uint *)(pp_Var7 + 0x29) <=
                        **(uint **)(auStack_2b0 + (long)pBVar33 * 2 + 0x10)) {
                      pcStack_348 = (code *)0x124d47;
                      allocInst();
                      goto LAB_00124d47;
                    }
                    pBVar38 = (BaseRAPass *)
                              (ulong)(pBVar30 ==
                                     (BaseRAPass *)(ulong)*(uint *)(auStack_2b0 + (long)pBVar33));
                    pBVar49 = (BaseRAPass *)
                              (ulong)((int)pBVar49 +
                                      (uint)(pBVar30 ==
                                            (BaseRAPass *)
                                            (ulong)*(byte *)(*(long *)(pp_Var7[0x28] +
                                                                      (ulong)**(uint **)(auStack_2b0
                                                                                        + (long)
                                                  pBVar33 * 2 + 0x10) * 8) + 0x4a)) +
                                     (uint)(pBVar30 ==
                                           (BaseRAPass *)
                                           (ulong)*(uint *)(auStack_2b0 + (long)pBVar33)) * 2);
                  }
                  unaff_R15 = pBVar43;
                  if (uVar48 == 0) break;
                  pBVar33 = (BaseRAPass *)
                            ((long)&(pBVar33->super_FuncPass).super_Pass._vptr_Pass + 4);
                  pBVar30 = (BaseRAPass *)
                            ((long)&(pBVar30->super_FuncPass).super_Pass._vptr_Pass + 1);
                  unaff_R15 = (BaseRAPass *)
                              ((long)&(pBVar43->super_FuncPass).super_Pass._vptr_Pass + 1);
                  bVar53 = pBVar43 < pBVar41;
                  pBVar43 = unaff_R15;
                } while (bVar53);
              }
              in_R9 = pBVar42;
              pBVar33 = pBStack_330;
              if ((uint)pBVar46 < (uint)pBVar49) {
                ppBVar24 = (BaseRAPass **)pBVar36;
                pBVar46 = pBVar49;
              }
            }
            uVar28 = uVar28 - 1 & uVar28;
            pBVar29 = (BaseRAPass *)(ulong)uVar28;
          } while (uVar28 != 0);
        }
        bVar53 = (int)ppBVar24 == -1;
        pBVar40 = (BaseRAPass *)CONCAT71((int7)((ulong)pBVar40 >> 8),!bVar53);
        if (bVar53) {
          uStack_33c = 0x3d;
        }
        else {
          pBVar36 = (BaseRAPass *)0x0;
          pBVar29 = pBStack_2c8;
          if (uVar18 != 0) {
            pBVar41 = (BaseRAPass *)(ulong)(uVar18 * 8);
            in_R9 = (BaseRAPass *)0x0;
            do {
              pBVar38 = (BaseRAPass *)0x1;
              uVar20 = 1 << ((byte)ppBVar24 & 0x1f);
              puVar39 = *(uint **)((long)(&in_R9->_formatOptions + -10) + (long)auStack_2b0);
              pBVar29 = (BaseRAPass *)(ulong)*puVar39;
              if (pBVar29 == (BaseRAPass *)0xffffffff) goto LAB_00124d92;
              if (*(uint *)(&pBVar33->field_0x48 + 0xc) <= *puVar39) goto LAB_00124d97;
              bVar27 = *(byte *)((long)&((RALocalAllocator *)pBVar29)->_pass +
                                *(long *)(&pBVar33->field_0x48 + 0x18));
              pBVar29 = (BaseRAPass *)(ulong)bVar27;
              *(byte *)((long)puVar39 + 0xe) = (byte)ppBVar24;
              if ((uint)ppBVar24 == (uint)bVar27) {
                uVar18 = puVar39[2];
                puVar39[2] = uVar18 | 0x100;
                if ((uVar18 & 2) != 0) {
                  pBVar29 = *(BaseRAPass **)(&pBVar33->field_0x48 + 0x20);
                  puVar39 = (uint *)((long)(&pBVar29->_formatOptions + -10) + (long)pBVar31 * 4);
                  *puVar39 = *puVar39 | 1 << (bVar27 & 0x1f);
                }
                pBVar32 = (BaseRAPass *)(ulong)((int)pBVar32 - 1);
              }
              else {
                uVar18 = *(uint *)(*(long *)(&pBVar33->field_0x48 + 0x20) + (long)pBVar31 * 4) &
                         uVar20;
                pBVar29 = (BaseRAPass *)(ulong)uVar18;
                pBVar42 = (BaseRAPass *)(ulong)((uint)pBVar42 | uVar18);
              }
              uStack_31c = uStack_31c | uVar20;
              in_R9 = (BaseRAPass *)&(in_R9->super_FuncPass).super_Pass._cb;
              ppBVar24 = (BaseRAPass **)(ulong)((uint)ppBVar24 + 1);
            } while (pBVar41 != in_R9);
          }
        }
      }
      pBVar38 = (BaseRAPass *)0x1;
      pBVar46 = pBVar42;
      if ((char)pBVar40 != '\0') goto LAB_00123c9f;
    }
    else {
      uStack_33c = 3;
    }
LAB_00124d0e:
    iVar22 = (int)pBVar38;
    if (iVar22 != 0) goto LAB_00124d24;
  }
  iVar22 = 2;
LAB_00124d24:
  if (iVar22 == 2) {
    uStack_33c = 0;
  }
  return uStack_33c;
LAB_00124d47:
  pcStack_348 = (code *)0x124d4c;
  allocInst();
LAB_00124d4c:
  pcStack_348 = (code *)0x124d51;
  allocInst();
LAB_00124d51:
  pcStack_348 = (code *)0x124d56;
  allocInst();
  pBVar44 = pBVar33;
  pBVar46 = pBVar29;
LAB_00124d56:
  pBVar29 = pBVar30;
  pcStack_348 = (code *)0x124d5b;
  allocInst();
LAB_00124d5b:
  pcStack_348 = (code *)0x124d60;
  allocInst();
  pBVar32 = pBVar35;
  in_R9 = pBVar42;
  pBVar33 = pBVar44;
  pBVar42 = pBVar46;
  unaff_R15 = pBVar43;
LAB_00124d60:
  pcStack_348 = (code *)0x124d65;
  allocInst();
LAB_00124d65:
  pcStack_348 = (code *)0x124d6a;
  allocInst();
LAB_00124d6a:
  pcStack_348 = (code *)0x124d6f;
  allocInst();
  pBVar30 = pBVar29;
  pBVar35 = pBVar32;
  pBVar46 = pBVar42;
  pBVar50 = pBVar49;
LAB_00124d6f:
  pcStack_348 = (code *)0x124d74;
  allocInst();
LAB_00124d74:
  pcStack_348 = (code *)0x124d79;
  allocInst();
  pBVar42 = pBVar46;
LAB_00124d79:
  pcStack_348 = (code *)0x124d7e;
  allocInst();
LAB_00124d7e:
  pcStack_348 = (code *)0x124d83;
  allocInst();
  pBVar29 = pBVar30;
LAB_00124d83:
  pcStack_348 = (code *)0x124d88;
  allocInst();
LAB_00124d88:
  pcStack_348 = (code *)0x124d8d;
  allocInst();
  pBVar32 = pBVar35;
LAB_00124d8d:
  pcStack_348 = (code *)0x124d92;
  allocInst();
LAB_00124d92:
  pcStack_348 = (code *)0x124d97;
  allocInst();
LAB_00124d97:
  pcStack_348 = (code *)0x124d9c;
  allocInst();
LAB_00124d9c:
  pcStack_348 = (code *)0x124da1;
  allocInst();
  pBVar35 = pBVar32;
LAB_00124da1:
  pcStack_348 = (code *)0x124da6;
  allocInst();
LAB_00124da6:
  pcStack_348 = (code *)0x124dab;
  allocInst();
LAB_00124dab:
  pcStack_348 = (code *)0x124db0;
  allocInst();
LAB_00124db0:
  pBVar30 = pBVar29;
  pcStack_348 = (code *)0x124db5;
  allocInst();
LAB_00124db5:
  pcStack_348 = (code *)0x124dba;
  allocInst();
LAB_00124dba:
  pcStack_348 = (code *)0x124dbf;
  allocInst();
LAB_00124dbf:
  pcStack_348 = decideOnAssignment;
  allocInst();
  uVar19 = (uint)pBVar41;
  if (uVar19 == 0) {
    pcStack_350 = (code *)0x124e1c;
    decideOnAssignment();
LAB_00124e1c:
    pcStack_350 = (code *)0x124e21;
    decideOnAssignment();
  }
  else {
    pp_Var7 = (pBVar40->super_FuncPass).super_Pass._vptr_Pass;
    if (*(uint *)(pp_Var7 + 0x29) <= extraout_EDX) goto LAB_00124e1c;
    pBVar30 = *(BaseRAPass **)(pp_Var7[0x28] + (ulong)extraout_EDX * 8);
    bVar27 = (((RALocalAllocator *)pBVar30)->_curAssignment)._layout.physIndex.super_RARegCount.
             field_0._regs[2];
    if ((bVar27 != 0xff) && ((uVar19 >> (bVar27 & 0x1f) & 1) != 0)) {
      return (uint)bVar27;
    }
    if ((byte)pBVar38 < 4) {
      uVar20 = (((RALocalAllocator *)pBVar30)->_funcPreservedRegs)._masks._data[1] & uVar19;
      if (uVar20 == 0) {
        uVar20 = uVar19;
      }
      uVar19 = ~*(uint *)(&pBVar40->field_0x38 + ((ulong)pBVar38 & 0xff) * 4) & uVar20;
      if (uVar19 == 0) {
        uVar19 = uVar20;
      }
      uVar20 = 0;
      if (uVar19 == 0) {
        return 0;
      }
      for (; (uVar19 >> uVar20 & 1) == 0; uVar20 = uVar20 + 1) {
      }
      return uVar20;
    }
  }
  uVar19 = (uint)pBVar30;
  pcStack_350 = decideOnReassignment;
  decideOnAssignment();
  uVar20 = (uint)pBVar41;
  if (uVar20 == 0) {
    ppBStack_358 = (BaseRAPass **)0x124ef1;
    decideOnReassignment();
LAB_00124ef1:
    ppBStack_358 = (BaseRAPass **)0x124ef6;
    decideOnReassignment();
  }
  else {
    pp_Var7 = (pBVar40->super_FuncPass).super_Pass._vptr_Pass;
    if (*(uint *)(pp_Var7 + 0x29) <= extraout_EDX_00) goto LAB_00124ef1;
    lVar37 = *(long *)(pp_Var7[0x28] + (ulong)extraout_EDX_00 * 8);
    bVar27 = *(byte *)(lVar37 + 0x4a);
    if ((bVar27 != 0xff) && ((uVar20 >> (bVar27 & 0x1f) & 1) != 0)) {
      return (uint)bVar27;
    }
    uVar19 = extraout_EDX_00;
    if ((byte)pBVar38 < 4) {
      uVar47 = (ulong)pBVar38 & 0xff;
      uVar19 = (uint)uVar47;
      uVar34 = (ulong)*(byte *)((long)(((RARegMask *)&in_R9->_allocator)->_masks)._data + uVar47);
      if (uVar34 != 0) {
        puVar39 = (uint *)((long)(((RAAssignment *)&in_R9->field_0x48)->_physToWorkIds)._data +
                          ((ulong)((*(uint *)((long)&(in_R9->super_FuncPass).super_Pass._name + 4)
                                    >> ((byte)pBVar38 * '\b' & 0x1f) & 0xff) << 5) - 0x24));
        do {
          if (*puVar39 == extraout_EDX_00) goto LAB_00124eab;
          puVar39 = puVar39 + 8;
          uVar34 = uVar34 - 1;
        } while (uVar34 != 0);
      }
      puVar39 = (uint *)0x0;
LAB_00124eab:
      if ((puVar39 != (uint *)0x0) && ((puVar39[2] & 0x40008) != 0)) {
        uVar19 = 0;
        if (uVar20 == 0) {
          return 0;
        }
        for (; (uVar20 >> uVar19 & 1) == 0; uVar19 = uVar19 + 1) {
        }
        return uVar19;
      }
      if ((*(byte *)(lVar37 + 0x24) & 4) == 0) {
        uVar20 = ~*(uint *)(lVar37 + 0x38) & uVar20;
        if (uVar20 != 0) {
          uVar18 = ~*(uint *)(&pBVar40->field_0x38 + uVar47 * 4) & uVar20;
          if (uVar18 == 0) {
            uVar18 = uVar20;
          }
          uVar19 = 0;
          if (uVar18 != 0) {
            for (; (uVar18 >> uVar19 & 1) == 0; uVar19 = uVar19 + 1) {
            }
          }
        }
        if (uVar20 != 0) {
          return uVar19;
        }
      }
      return 0xff;
    }
  }
  ppBStack_358 = (BaseRAPass **)0x124efb;
  decideOnReassignment();
  ppBVar24 = (BaseRAPass **)pBVar36;
  pBVar31 = unaff_R15;
  pBStack_378 = pBVar35;
  pBStack_370 = pBVar33;
  pBStack_368 = pBVar50;
  pBStack_360 = unaff_R15;
  ppBStack_358 = (BaseRAPass **)pBVar36;
  if (uVar19 == 0) {
LAB_00124fda:
    ppBStack_380 = (BaseRAPass **)0x124fdf;
    decideOnSpillFor();
  }
  else if ((byte)pBVar38 < 4) {
    uVar20 = 0;
    if (uVar19 != 0) {
      for (; (uVar19 >> uVar20 & 1) == 0; uVar20 = uVar20 + 1) {
      }
    }
    uVar47 = (ulong)pBVar38 & 0xff;
    pBVar38 = *(BaseRAPass **)(&pBVar40->field_0x48 + uVar47 * 8 + 0x28);
    uVar18 = *(uint *)(&pBVar38->_allocator + ((ulong)uVar20 - 6) * 4);
    pBVar29 = (BaseRAPass *)(ulong)uVar18;
    uVar19 = uVar19 - 1 & uVar19;
    if (uVar19 == 0) {
LAB_00124fc9:
      *(uint *)&(pBVar41->super_FuncPass).super_Pass._vptr_Pass = uVar18;
      return uVar20;
    }
    pp_Var7 = (pBVar40->super_FuncPass).super_Pass._vptr_Pass;
    uVar45 = *(uint *)(pp_Var7 + 0x29);
    if (uVar18 < uVar45) {
      p_Var9 = pp_Var7[0x28];
      uVar48 = (uint)(*(float *)(*(long *)(p_Var9 + (long)pBVar29 * 8) + 100) * 1048576.0);
      uVar28 = *(uint *)(*(long *)(&pBVar40->field_0x48 + 0x20) + 0x10 + uVar47 * 4);
      pBVar40 = (BaseRAPass *)(ulong)uVar28;
      uVar18 = uVar48 + 0x40000;
      if ((uVar28 >> (uVar20 & 0x1f) & 1) == 0) {
        uVar18 = uVar48;
      }
      pBVar36 = (BaseRAPass *)(ulong)uVar18;
      do {
        uVar48 = 0;
        if (uVar19 != 0) {
          for (; (uVar19 >> uVar48 & 1) == 0; uVar48 = uVar48 + 1) {
          }
        }
        pBVar35 = (BaseRAPass *)(ulong)uVar48;
        pBVar50 = (BaseRAPass *)
                  (ulong)*(uint *)(&pBVar38->_allocator +
                                  (long)(&pBVar35[-1].field_0x3b0 + 0xfa) * 4);
        if (uVar45 <= *(uint *)(&pBVar38->_allocator + (long)(&pBVar35[-1].field_0x3b0 + 0xfa) * 4))
        {
          ppBStack_380 = (BaseRAPass **)0x124fda;
          decideOnSpillFor();
          goto LAB_00124fda;
        }
        uVar18 = (uint)(*(float *)(*(long *)(p_Var9 + (long)pBVar50 * 8) + 100) * 1048576.0);
        pBVar31 = (BaseRAPass *)(ulong)uVar18;
        pBVar33 = (BaseRAPass *)(ulong)(uVar18 + 0x40000);
        if ((uVar28 >> (uVar48 & 0x1f) & 1) == 0) {
          pBVar33 = pBVar31;
        }
        bVar53 = (uint)pBVar33 < (uint)pBVar36;
        if (bVar53) {
          pBVar29 = pBVar50;
          pBVar36 = pBVar33;
        }
        uVar18 = (uint)pBVar29;
        if (bVar53) {
          uVar20 = uVar48;
        }
        uVar19 = uVar19 - 1 & uVar19;
        ppBVar24 = (BaseRAPass **)(ulong)uVar19;
      } while (uVar19 != 0);
      goto LAB_00124fc9;
    }
    goto LAB_00124fe4;
  }
  ppBStack_380 = (BaseRAPass **)0x124fe4;
  decideOnSpillFor();
LAB_00124fe4:
  ppBStack_380 = (BaseRAPass **)0x124fe9;
  decideOnSpillFor();
  uVar47 = *(ulong *)&pBVar38->field_0x20;
  node = (InstNode *)(ulong)*(uint *)(uVar47 + 0x10);
  if (node != (InstNode *)0x0) {
    pBStack_3c0 = (BaseRAPass *)&pBVar40->field_0x48;
    lVar37 = uVar47 + 0x54;
    pIVar52 = (InstNode *)0x0;
    pBVar41 = pBVar40;
    pIStack_3b8 = node;
    pBStack_3b0 = pBVar38;
    pBStack_3a8 = pBVar35;
    pBStack_3a0 = pBVar33;
    pBStack_398 = pBVar42;
    pBStack_390 = pBVar50;
    pBStack_388 = pBVar31;
    ppBStack_380 = ppBVar24;
    do {
      if ((InstNode *)(ulong)*(uint *)(uVar47 + 0x10) <= pIVar52) {
        lStack_3d8 = 0x125140;
        spillAfterAllocation();
LAB_00125140:
        lStack_3d8 = 0x125145;
        spillAfterAllocation();
LAB_00125145:
        lStack_3d8 = 0x12514a;
        spillAfterAllocation();
LAB_0012514a:
        lStack_3d8 = 0x12514f;
        spillAfterAllocation();
LAB_0012514f:
        lStack_3d8 = 0x125154;
        spillAfterAllocation();
LAB_00125154:
        lStack_3d8 = 0x125159;
        spillAfterAllocation();
        ((pBVar41->super_FuncPass).super_Pass._cb)->_cursor = *(BaseNode **)node;
        uStack_400 = uVar47;
        pBStack_3f8 = pBVar33;
        pBStack_3f0 = pBVar42;
        pBStack_3e8 = pBVar40;
        pIStack_3e0 = pIVar52;
        lStack_3d8 = lVar37;
        if (*(PhysToWorkMap **)(block + 200) != (PhysToWorkMap *)0x0) {
          EVar23 = switchToAssignment((RALocalAllocator *)pBVar41,*(PhysToWorkMap **)(block + 200),
                                      (ZoneBitVector *)(block + 0x78),
                                      SUB41((*(uint *)(block + 0xc) & 8) >> 3,0),true);
          uVar47 = (ulong)EVar23;
          if (EVar23 != 0) {
            return EVar23;
          }
        }
        EVar23 = allocInst((RALocalAllocator *)pBVar41,node);
        if (EVar23 != 0) {
          return EVar23;
        }
        uVar19 = *(uint *)(block + 0xb8);
        if ((ulong)uVar19 == 0xffffffff) {
          pRVar26 = block + 0xbc;
LAB_001251fe:
          EVar23 = spillScratchGpRegsBeforeEntry((RALocalAllocator *)pBVar41,*(RegMask *)pRVar26);
          if (EVar23 != 0) {
            return EVar23;
          }
          pBVar33 = (BaseRAPass *)(pBVar41->super_FuncPass).super_Pass._vptr_Pass;
          if (*(long *)(block + 200) == 0) {
            EVar23 = BaseRAPass::setBlockEntryAssignment
                               (pBVar33,block,*(RABlock **)&pBVar41->field_0xd8,
                                (RAAssignment *)&pBVar41->field_0x48);
            if (EVar23 != 0) {
              return EVar23;
            }
            goto LAB_001253c0;
          }
          pBVar11 = *(BaseNode **)pBVar33->_extraBlock;
          pRVar26 = (RABlock *)
                    BaseBuilder::setCursor((pBVar41->super_FuncPass).super_Pass._cb,pBVar11);
          __src = *(void **)(&pBVar41->field_0x48 + 0x18);
          memcpy(*(void **)&pBVar41->_blocks,*(void **)(&pBVar41->field_0x48 + 0x20),
                 (ulong)*(uint *)&pBVar41->_func * 4 + 0x20);
          memcpy(pBVar41->_extraBlock,__src,(ulong)*(uint *)((long)&pBVar41->_func + 4));
          bVar53 = false;
          EVar23 = switchToAssignment((RALocalAllocator *)pBVar41,*(PhysToWorkMap **)(block + 200),
                                      (ZoneBitVector *)(block + 0x78),
                                      SUB41((*(uint *)(block + 0xc) & 8) >> 3,0),false);
          if (EVar23 != 0) goto LAB_001253bb;
          pBVar12 = (pBVar41->super_FuncPass).super_Pass._cb;
          EVar23 = (Error)uVar47;
          if (pBVar12->_cursor != pBVar11) {
            if ((uint)(byte)node[0x13] <= (byte)node[0x12] - 1) goto LAB_001253d8;
            lVar37 = (ulong)((byte)node[0x12] - 1) * 0x10;
            if ((*(uint *)(node + lVar37 + 0x40) & 7) != 5) goto LAB_001253dd;
            (*(pBVar12->super_BaseEmitter)._vptr_BaseEmitter[4])(&uStack_428);
            uStack_418 = *(undefined8 *)(node + lVar37 + 0x40);
            uStack_410 = *(undefined8 *)(node + lVar37 + 0x48);
            *(undefined4 *)(node + lVar37 + 0x40) = uStack_428;
            *(undefined4 *)(node + lVar37 + 0x44) = uStack_424;
            *(undefined4 *)(node + lVar37 + 0x48) = uStack_420;
            *(undefined4 *)(node + lVar37 + 0x4c) = uStack_41c;
            node[0x34] = (InstNode)((byte)node[0x34] & 0xef);
            EVar23 = (**(code **)(*(pBVar41->super_FuncPass).super_Pass._vptr_Pass + 0x68))();
            bVar53 = EVar23 == 0;
            if (bVar53) {
              pBVar12 = (pBVar41->super_FuncPass).super_Pass._cb;
              pBVar12->_cursor = pBVar11;
              (*(pBVar12->super_BaseEmitter)._vptr_BaseEmitter[6])(pBVar12,&uStack_428);
              EVar23 = (Error)uVar47;
            }
            goto LAB_00125340;
          }
        }
        else {
          if (uVar19 < *(uint *)(*(long *)block + 0xf0)) {
            pRVar26 = (RABlock *)((ulong)uVar19 * 0x20 + *(long *)(*(long *)block + 0xe8));
            goto LAB_001251fe;
          }
          allocBranch();
          pRVar26 = block;
LAB_001253d8:
          allocBranch();
LAB_001253dd:
          EVar23 = 3;
          bVar53 = false;
LAB_00125340:
          if (!bVar53) {
            bVar53 = false;
            goto LAB_001253bb;
          }
        }
        ((pBVar41->super_FuncPass).super_Pass._cb)->_cursor = (BaseNode *)pRVar26;
        pBVar11 = *(BaseNode **)(&pBVar41->field_0x48 + 0x18);
        uVar13 = *(undefined8 *)(&pBVar41->field_0x48 + 0x20);
        uVar14 = *(undefined8 *)&pBVar41->_blocks;
        *(BaseNode **)(&pBVar41->field_0x48 + 0x18) = pBVar41->_extraBlock;
        *(undefined8 *)(&pBVar41->field_0x48 + 0x20) = uVar14;
        pBVar41->_extraBlock = pBVar11;
        *(undefined8 *)&pBVar41->_blocks = uVar13;
        lVar37 = 0;
        do {
          uVar13 = *(undefined8 *)(&pBVar41->field_0x48 + lVar37 * 8 + 0x28);
          uVar14 = *(undefined8 *)((long)(&pBVar41->field_0x48 + lVar37 * 8 + 0x28) + 8);
          uVar15 = ((undefined8 *)((long)(&pBVar41->_formatOptions + 4) + lVar37 * 8))[1];
          *(undefined8 *)(&pBVar41->field_0x48 + lVar37 * 8 + 0x28) =
               *(undefined8 *)((long)(&pBVar41->_formatOptions + 4) + lVar37 * 8);
          *(undefined8 *)((long)(&pBVar41->field_0x48 + lVar37 * 8 + 0x28) + 8) = uVar15;
          *(undefined8 *)((long)(&pBVar41->_formatOptions + 4) + lVar37 * 8) = uVar13;
          ((undefined8 *)((long)(&pBVar41->_formatOptions + 4) + lVar37 * 8))[1] = uVar14;
          lVar37 = lVar37 + 2;
        } while (lVar37 != 4);
        bVar53 = true;
LAB_001253bb:
        if (bVar53) {
LAB_001253c0:
          EVar23 = 0;
        }
        return EVar23;
      }
      bVar53 = true;
      if ((*(byte *)(lVar37 + 2) & 2) != 0) {
        uVar19 = *(uint *)(lVar37 + -8);
        pBVar33 = (BaseRAPass *)(ulong)uVar19;
        pp_Var7 = (pBVar40->super_FuncPass).super_Pass._vptr_Pass;
        if (*(uint *)(pp_Var7 + 0x29) <= uVar19) goto LAB_00125140;
        lVar10 = *(long *)(pp_Var7[0x28] + (long)pBVar33 * 8);
        if (*(char *)(lVar10 + 0x4a) != -1) goto LAB_00125110;
        if (uVar19 == 0xffffffff) goto LAB_00125145;
        if (*(uint *)(&pBVar40->field_0x48 + 0xc) <= uVar19) goto LAB_0012514a;
        bVar27 = *(byte *)((long)&(pBVar33->super_FuncPass).super_Pass._vptr_Pass +
                          *(long *)(&pBVar40->field_0x48 + 0x18));
        pBVar42 = (BaseRAPass *)(ulong)bVar27;
        if (bVar27 == 0xff) goto LAB_00125110;
        RVar17 = *(RegGroup *)(lVar10 + 0x21);
        ((pBVar40->super_FuncPass).super_Pass._cb)->_cursor = (BaseNode *)pBStack_3b0;
        if (0x1f < bVar27) goto LAB_0012514f;
        RVar17 = RVar17 & kMaxValue;
        if (kExtraVirt3 < RVar17) goto LAB_00125154;
        if ((*(uint *)(*(long *)(&pBVar40->field_0x48 + 0x20) + 0x10 + (ulong)RVar17 * 4) >>
             (bVar27 & 0x1f) & 1) == 0) {
LAB_001250e9:
          lStack_3d8 = 0x1250f9;
          pBVar41 = pBStack_3c0;
          RAAssignment::unassign((RAAssignment *)pBStack_3c0,RVar17,uVar19,(uint)bVar27);
          EVar23 = 0;
        }
        else {
          lStack_3d8 = 0x1250e0;
          pBVar41 = pBVar40;
          uStack_3c8 = (ulong)RVar17;
          EVar23 = onSaveReg((RALocalAllocator *)pBVar40,RVar17,uVar19,(uint)bVar27);
          RVar17 = (RegGroup)uStack_3c8;
          if (EVar23 == 0) goto LAB_001250e9;
        }
        bVar53 = EVar23 == 0;
        node = pIStack_3b8;
        if (!bVar53) {
          EStack_3cc = EVar23;
        }
      }
LAB_00125110:
      if (!bVar53) {
        return EStack_3cc;
      }
      pIVar52 = pIVar52 + 1;
      lVar37 = lVar37 + 0x20;
    } while (node != pIVar52);
  }
  return 0;
}

Assistant:

Error RALocalAllocator::spillScratchGpRegsBeforeEntry(RegMask scratchRegs) noexcept {
  RegGroup group = RegGroup::kGp;
  Support::BitWordIterator<RegMask> it(scratchRegs);

  while (it.hasNext()) {
    uint32_t physId = it.next();
    if (_curAssignment.isPhysAssigned(group, physId)) {
      uint32_t workId = _curAssignment.physToWorkId(group, physId);
      ASMJIT_PROPAGATE(onSpillReg(group, workId, physId));
    }
  }

  return kErrorOk;
}